

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<4>::
     intersect_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  undefined8 unaff_RBP;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  float fVar86;
  undefined4 uVar87;
  float fVar95;
  float fVar96;
  vint4 bi_2;
  undefined1 auVar88 [16];
  float fVar97;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  vint4 ai_2;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  vint4 bi;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  vint4 ai;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  vint4 ai_1;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  float fVar156;
  vfloat4 a0_3;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  __m128 a_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  __m128 a;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar183;
  float fVar194;
  float fVar196;
  vfloat4 a0_1;
  float fVar198;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar195;
  float fVar197;
  float fVar199;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar211;
  float fVar212;
  vfloat4 a0;
  undefined1 auVar204 [16];
  float fVar213;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  ulong local_328;
  float local_31c;
  long local_318;
  ulong local_310;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  Primitive *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined8 local_218;
  float local_210;
  undefined8 local_20c;
  uint local_204;
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  uint auStack_168 [4];
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar23;
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar222 [32];
  
  uVar22 = (ulong)(byte)prim[1];
  fVar202 = *(float *)(prim + uVar22 * 0x19 + 0x12);
  auVar33 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar22 * 0x19 + 6));
  auVar49._0_4_ = fVar202 * auVar33._0_4_;
  auVar49._4_4_ = fVar202 * auVar33._4_4_;
  auVar49._8_4_ = fVar202 * auVar33._8_4_;
  auVar49._12_4_ = fVar202 * auVar33._12_4_;
  auVar48._0_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar48._4_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar48._8_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar48._12_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 4 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 5 + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 6 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xb + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xc + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xd + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x12 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x13 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x14 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar214._4_4_ = auVar48._0_4_;
  auVar214._0_4_ = auVar48._0_4_;
  auVar214._8_4_ = auVar48._0_4_;
  auVar214._12_4_ = auVar48._0_4_;
  auVar41 = vshufps_avx(auVar48,auVar48,0x55);
  auVar43 = vshufps_avx(auVar48,auVar48,0xaa);
  fVar202 = auVar43._0_4_;
  auVar118._0_4_ = fVar202 * auVar35._0_4_;
  fVar183 = auVar43._4_4_;
  auVar118._4_4_ = fVar183 * auVar35._4_4_;
  fVar195 = auVar43._8_4_;
  auVar118._8_4_ = fVar195 * auVar35._8_4_;
  fVar197 = auVar43._12_4_;
  auVar118._12_4_ = fVar197 * auVar35._12_4_;
  auVar46._0_4_ = auVar38._0_4_ * fVar202;
  auVar46._4_4_ = auVar38._4_4_ * fVar183;
  auVar46._8_4_ = auVar38._8_4_ * fVar195;
  auVar46._12_4_ = auVar38._12_4_ * fVar197;
  auVar88._0_4_ = auVar40._0_4_ * fVar202;
  auVar88._4_4_ = auVar40._4_4_ * fVar183;
  auVar88._8_4_ = auVar40._8_4_ * fVar195;
  auVar88._12_4_ = auVar40._12_4_ * fVar197;
  auVar43 = vfmadd231ps_fma(auVar118,auVar41,auVar34);
  auVar44 = vfmadd231ps_fma(auVar46,auVar41,auVar42);
  auVar41 = vfmadd231ps_fma(auVar88,auVar39,auVar41);
  auVar45 = vfmadd231ps_fma(auVar43,auVar214,auVar33);
  auVar44 = vfmadd231ps_fma(auVar44,auVar214,auVar36);
  auVar48 = vfmadd231ps_fma(auVar41,auVar37,auVar214);
  auVar215._4_4_ = auVar49._0_4_;
  auVar215._0_4_ = auVar49._0_4_;
  auVar215._8_4_ = auVar49._0_4_;
  auVar215._12_4_ = auVar49._0_4_;
  auVar41 = vshufps_avx(auVar49,auVar49,0x55);
  auVar43 = vshufps_avx(auVar49,auVar49,0xaa);
  fVar202 = auVar43._0_4_;
  auVar223._0_4_ = fVar202 * auVar35._0_4_;
  fVar183 = auVar43._4_4_;
  auVar223._4_4_ = fVar183 * auVar35._4_4_;
  fVar195 = auVar43._8_4_;
  auVar223._8_4_ = fVar195 * auVar35._8_4_;
  fVar197 = auVar43._12_4_;
  auVar223._12_4_ = fVar197 * auVar35._12_4_;
  auVar51._0_4_ = auVar38._0_4_ * fVar202;
  auVar51._4_4_ = auVar38._4_4_ * fVar183;
  auVar51._8_4_ = auVar38._8_4_ * fVar195;
  auVar51._12_4_ = auVar38._12_4_ * fVar197;
  auVar50._0_4_ = auVar40._0_4_ * fVar202;
  auVar50._4_4_ = auVar40._4_4_ * fVar183;
  auVar50._8_4_ = auVar40._8_4_ * fVar195;
  auVar50._12_4_ = auVar40._12_4_ * fVar197;
  auVar34 = vfmadd231ps_fma(auVar223,auVar41,auVar34);
  auVar35 = vfmadd231ps_fma(auVar51,auVar41,auVar42);
  auVar42 = vfmadd231ps_fma(auVar50,auVar41,auVar39);
  auVar39 = vfmadd231ps_fma(auVar34,auVar215,auVar33);
  auVar40 = vfmadd231ps_fma(auVar35,auVar215,auVar36);
  auVar41 = vfmadd231ps_fma(auVar42,auVar215,auVar37);
  auVar70._16_16_ = in_YmmResult._16_16_;
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar233 = ZEXT1664(auVar33);
  auVar126._8_4_ = 0x219392ef;
  auVar126._0_8_ = 0x219392ef219392ef;
  auVar126._12_4_ = 0x219392ef;
  auVar34 = vandps_avx512vl(auVar45,auVar33);
  uVar27 = vcmpps_avx512vl(auVar34,auVar126,1);
  bVar30 = (bool)((byte)uVar27 & 1);
  auVar43._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar45._0_4_;
  bVar30 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar45._4_4_;
  bVar30 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar45._8_4_;
  bVar30 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar45._12_4_;
  auVar34 = vandps_avx512vl(auVar44,auVar33);
  uVar27 = vcmpps_avx512vl(auVar34,auVar126,1);
  bVar30 = (bool)((byte)uVar27 & 1);
  auVar45._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar44._0_4_;
  bVar30 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar44._4_4_;
  bVar30 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar44._8_4_;
  bVar30 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar44._12_4_;
  auVar33 = vandps_avx512vl(auVar48,auVar33);
  uVar27 = vcmpps_avx512vl(auVar33,auVar126,1);
  bVar30 = (bool)((byte)uVar27 & 1);
  auVar44._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar48._0_4_;
  bVar30 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar48._4_4_;
  bVar30 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar48._8_4_;
  bVar30 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar48._12_4_;
  auVar33 = vrcp14ps_avx512vl(auVar43);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar234 = ZEXT1664(auVar34);
  auVar35 = vfnmadd213ps_avx512vl(auVar43,auVar33,auVar34);
  auVar35 = vfmadd132ps_fma(auVar35,auVar33,auVar33);
  auVar33 = vrcp14ps_avx512vl(auVar45);
  auVar36 = vfnmadd213ps_avx512vl(auVar45,auVar33,auVar34);
  auVar38 = vfmadd132ps_fma(auVar36,auVar33,auVar33);
  auVar33 = vrcp14ps_avx512vl(auVar44);
  auVar34 = vfnmadd213ps_avx512vl(auVar44,auVar33,auVar34);
  auVar37 = vfmadd132ps_fma(auVar34,auVar33,auVar33);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar22 * 7 + 6);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar39);
  auVar127._0_4_ = auVar35._0_4_ * auVar33._0_4_;
  auVar127._4_4_ = auVar35._4_4_ * auVar33._4_4_;
  auVar127._8_4_ = auVar35._8_4_ * auVar33._8_4_;
  auVar127._12_4_ = auVar35._12_4_ * auVar33._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar22 * 9 + 6);
  auVar33 = vpmovsxwd_avx(auVar34);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar39);
  auVar119._0_4_ = auVar35._0_4_ * auVar33._0_4_;
  auVar119._4_4_ = auVar35._4_4_ * auVar33._4_4_;
  auVar119._8_4_ = auVar35._8_4_ * auVar33._8_4_;
  auVar119._12_4_ = auVar35._12_4_ * auVar33._12_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar22 * 0xe + 6);
  auVar33 = vpmovsxwd_avx(auVar35);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar40);
  auVar138._0_4_ = auVar38._0_4_ * auVar33._0_4_;
  auVar138._4_4_ = auVar38._4_4_ * auVar33._4_4_;
  auVar138._8_4_ = auVar38._8_4_ * auVar33._8_4_;
  auVar138._12_4_ = auVar38._12_4_ * auVar33._12_4_;
  auVar35 = vpbroadcastd_avx512vl();
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar33 = vpmovsxwd_avx(auVar36);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar34 = vsubps_avx(auVar33,auVar40);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar22 * 0x15 + 6);
  auVar33 = vpmovsxwd_avx(auVar42);
  auVar47._0_4_ = auVar38._0_4_ * auVar34._0_4_;
  auVar47._4_4_ = auVar38._4_4_ * auVar34._4_4_;
  auVar47._8_4_ = auVar38._8_4_ * auVar34._8_4_;
  auVar47._12_4_ = auVar38._12_4_ * auVar34._12_4_;
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar41);
  auVar113._0_4_ = auVar37._0_4_ * auVar33._0_4_;
  auVar113._4_4_ = auVar37._4_4_ * auVar33._4_4_;
  auVar113._8_4_ = auVar37._8_4_ * auVar33._8_4_;
  auVar113._12_4_ = auVar37._12_4_ * auVar33._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar22 * 0x17 + 6);
  auVar33 = vpmovsxwd_avx(auVar38);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar41);
  auVar52._0_4_ = auVar37._0_4_ * auVar33._0_4_;
  auVar52._4_4_ = auVar37._4_4_ * auVar33._4_4_;
  auVar52._8_4_ = auVar37._8_4_ * auVar33._8_4_;
  auVar52._12_4_ = auVar37._12_4_ * auVar33._12_4_;
  auVar33 = vpminsd_avx(auVar127,auVar119);
  auVar34 = vpminsd_avx(auVar138,auVar47);
  auVar33 = vmaxps_avx(auVar33,auVar34);
  auVar34 = vpminsd_avx(auVar113,auVar52);
  uVar87 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar37._4_4_ = uVar87;
  auVar37._0_4_ = uVar87;
  auVar37._8_4_ = uVar87;
  auVar37._12_4_ = uVar87;
  auVar34 = vmaxps_avx512vl(auVar34,auVar37);
  auVar33 = vmaxps_avx(auVar33,auVar34);
  auVar39._8_4_ = 0x3f7ffffa;
  auVar39._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar39._12_4_ = 0x3f7ffffa;
  local_158 = vmulps_avx512vl(auVar33,auVar39);
  auVar33 = vpmaxsd_avx(auVar127,auVar119);
  auVar34 = vpmaxsd_avx(auVar138,auVar47);
  auVar33 = vminps_avx(auVar33,auVar34);
  auVar34 = vpmaxsd_avx(auVar113,auVar52);
  fVar202 = (ray->super_RayK<1>).tfar;
  auVar40._4_4_ = fVar202;
  auVar40._0_4_ = fVar202;
  auVar40._8_4_ = fVar202;
  auVar40._12_4_ = fVar202;
  auVar34 = vminps_avx512vl(auVar34,auVar40);
  auVar33 = vminps_avx(auVar33,auVar34);
  auVar41._8_4_ = 0x3f800003;
  auVar41._0_8_ = 0x3f8000033f800003;
  auVar41._12_4_ = 0x3f800003;
  auVar33 = vmulps_avx512vl(auVar33,auVar41);
  uVar10 = vcmpps_avx512vl(local_158,auVar33,2);
  uVar11 = vpcmpgtd_avx512vl(auVar35,_DAT_01f4ad30);
  uVar27 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)((byte)uVar10 & 0xf & (byte)uVar11));
  auVar70._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar237 = ZEXT1664(auVar70._0_16_);
  auVar235 = ZEXT464(0x3f800000);
LAB_017d7e73:
  if (uVar27 == 0) {
    return;
  }
  lVar24 = 0;
  for (uVar22 = uVar27; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    lVar24 = lVar24 + 1;
  }
  local_328 = (ulong)*(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_310 = (ulong)*(uint *)(prim + lVar24 * 4 + 6);
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar22 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(prim + lVar24 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar33 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar22);
  lVar24 = uVar22 + 1;
  auVar34 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar24);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar35 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar22);
  auVar36 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar24);
  auVar53._16_16_ = auVar70._16_16_;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar38 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar22),
                       auVar33,auVar37);
  auVar39 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar24),
                       auVar34,auVar37);
  auVar40 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar22 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar35,auVar37);
  auVar41 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar24),
                       auVar36,auVar37);
  auVar53._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar42 = vmulps_avx512vl(auVar34,auVar53._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar39,auVar53._0_16_);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar38,auVar43);
  auVar98._0_4_ = auVar33._0_4_ + auVar42._0_4_;
  auVar98._4_4_ = auVar33._4_4_ + auVar42._4_4_;
  auVar98._8_4_ = auVar33._8_4_ + auVar42._8_4_;
  auVar98._12_4_ = auVar33._12_4_ + auVar42._12_4_;
  auVar48 = auVar237._0_16_;
  auVar42 = vfmadd231ps_avx512vl(auVar43,auVar38,auVar48);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar33,auVar48);
  auVar42 = vmulps_avx512vl(auVar36,auVar53._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar42,auVar41,auVar53._0_16_);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar40,auVar44);
  auVar204._0_4_ = auVar35._0_4_ + auVar42._0_4_;
  auVar204._4_4_ = auVar35._4_4_ + auVar42._4_4_;
  auVar204._8_4_ = auVar35._8_4_ + auVar42._8_4_;
  auVar204._12_4_ = auVar35._12_4_ + auVar42._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar44,auVar40,auVar48);
  auVar44 = vfnmadd231ps_avx512vl(auVar42,auVar35,auVar48);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar39,auVar34);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar38,auVar53._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar42,auVar33,auVar53._0_16_);
  auVar34 = vmulps_avx512vl(auVar34,auVar48);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar48,auVar39);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar53._0_16_,auVar38);
  auVar39 = vfnmadd231ps_avx512vl(auVar34,auVar53._0_16_,auVar33);
  auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar41,auVar36);
  auVar33 = vfmadd231ps_avx512vl(auVar33,auVar40,auVar53._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar33,auVar35,auVar53._0_16_);
  auVar33 = vmulps_avx512vl(auVar36,auVar48);
  auVar33 = vfnmadd231ps_avx512vl(auVar33,auVar48,auVar41);
  auVar33 = vfmadd231ps_avx512vl(auVar33,auVar53._0_16_,auVar40);
  auVar38 = vfnmadd231ps_avx512vl(auVar33,auVar53._0_16_,auVar35);
  auVar33 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar34 = vshufps_avx(auVar204,auVar204,0xc9);
  fVar86 = auVar43._0_4_;
  auVar139._0_4_ = fVar86 * auVar34._0_4_;
  fVar95 = auVar43._4_4_;
  auVar139._4_4_ = fVar95 * auVar34._4_4_;
  fVar96 = auVar43._8_4_;
  auVar139._8_4_ = fVar96 * auVar34._8_4_;
  fVar97 = auVar43._12_4_;
  auVar139._12_4_ = fVar97 * auVar34._12_4_;
  auVar34 = vfmsub231ps_fma(auVar139,auVar33,auVar204);
  auVar35 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar157._0_4_ = auVar34._0_4_ * fVar86;
  auVar157._4_4_ = auVar34._4_4_ * fVar95;
  auVar157._8_4_ = auVar34._8_4_ * fVar96;
  auVar157._12_4_ = auVar34._12_4_ * fVar97;
  auVar33 = vfmsub231ps_fma(auVar157,auVar33,auVar44);
  auVar36 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar34 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar202 = auVar39._0_4_;
  auVar165._0_4_ = auVar34._0_4_ * fVar202;
  fVar183 = auVar39._4_4_;
  auVar165._4_4_ = auVar34._4_4_ * fVar183;
  fVar195 = auVar39._8_4_;
  auVar165._8_4_ = auVar34._8_4_ * fVar195;
  fVar197 = auVar39._12_4_;
  auVar165._12_4_ = auVar34._12_4_ * fVar197;
  auVar34 = vfmsub231ps_fma(auVar165,auVar33,auVar42);
  auVar42 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar166._0_4_ = auVar34._0_4_ * fVar202;
  auVar166._4_4_ = auVar34._4_4_ * fVar183;
  auVar166._8_4_ = auVar34._8_4_ * fVar195;
  auVar166._12_4_ = auVar34._12_4_ * fVar197;
  auVar33 = vfmsub231ps_fma(auVar166,auVar33,auVar38);
  auVar38 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vdpps_avx(auVar35,auVar35,0x7f);
  fVar199 = auVar33._0_4_;
  auVar68._4_28_ = auVar53._4_28_;
  auVar68._0_4_ = fVar199;
  auVar34 = vrsqrt14ss_avx512f(auVar53._0_16_,auVar68._0_16_);
  fVar200 = auVar34._0_4_;
  fVar201 = fVar200 * 1.5 - fVar199 * 0.5 * fVar200 * fVar200 * fVar200;
  auVar34 = vdpps_avx(auVar35,auVar36,0x7f);
  fVar203 = fVar201 * auVar35._0_4_;
  fVar211 = fVar201 * auVar35._4_4_;
  fVar212 = fVar201 * auVar35._8_4_;
  fVar213 = fVar201 * auVar35._12_4_;
  auVar158._0_4_ = fVar199 * auVar36._0_4_;
  auVar158._4_4_ = fVar199 * auVar36._4_4_;
  auVar158._8_4_ = fVar199 * auVar36._8_4_;
  auVar158._12_4_ = fVar199 * auVar36._12_4_;
  fVar199 = auVar34._0_4_;
  auVar140._0_4_ = fVar199 * auVar35._0_4_;
  auVar140._4_4_ = fVar199 * auVar35._4_4_;
  auVar140._8_4_ = fVar199 * auVar35._8_4_;
  auVar140._12_4_ = fVar199 * auVar35._12_4_;
  auVar35 = vsubps_avx(auVar158,auVar140);
  auVar34 = vrcp14ss_avx512f(auVar53._0_16_,auVar68._0_16_);
  auVar33 = vfnmadd213ss_avx512f(auVar33,auVar34,ZEXT416(0x40000000));
  fVar199 = auVar34._0_4_ * auVar33._0_4_;
  auVar33 = vdpps_avx(auVar42,auVar42,0x7f);
  fVar200 = auVar33._0_4_;
  auVar69._16_16_ = auVar53._16_16_;
  auVar69._0_16_ = auVar53._0_16_;
  auVar54._4_28_ = auVar69._4_28_;
  auVar54._0_4_ = fVar200;
  auVar34 = vrsqrt14ss_avx512f(auVar53._0_16_,auVar54._0_16_);
  fVar156 = auVar34._0_4_;
  fVar156 = fVar156 * 1.5 - fVar200 * 0.5 * fVar156 * fVar156 * fVar156;
  auVar34 = vdpps_avx(auVar42,auVar38,0x7f);
  fVar182 = fVar156 * auVar42._0_4_;
  fVar194 = fVar156 * auVar42._4_4_;
  fVar196 = fVar156 * auVar42._8_4_;
  fVar198 = fVar156 * auVar42._12_4_;
  auVar128._0_4_ = fVar200 * auVar38._0_4_;
  auVar128._4_4_ = fVar200 * auVar38._4_4_;
  auVar128._8_4_ = fVar200 * auVar38._8_4_;
  auVar128._12_4_ = fVar200 * auVar38._12_4_;
  fVar200 = auVar34._0_4_;
  auVar120._0_4_ = fVar200 * auVar42._0_4_;
  auVar120._4_4_ = fVar200 * auVar42._4_4_;
  auVar120._8_4_ = fVar200 * auVar42._8_4_;
  auVar120._12_4_ = fVar200 * auVar42._12_4_;
  auVar36 = vsubps_avx(auVar128,auVar120);
  auVar34 = vrcp14ss_avx512f(auVar53._0_16_,auVar54._0_16_);
  auVar33 = vfnmadd213ss_avx512f(auVar33,auVar34,ZEXT416(0x40000000));
  fVar200 = auVar34._0_4_ * auVar33._0_4_;
  auVar33 = vshufps_avx(auVar98,auVar98,0xff);
  auVar149._0_4_ = fVar203 * auVar33._0_4_;
  auVar149._4_4_ = fVar211 * auVar33._4_4_;
  auVar149._8_4_ = fVar212 * auVar33._8_4_;
  auVar149._12_4_ = fVar213 * auVar33._12_4_;
  local_178 = vsubps_avx(auVar98,auVar149);
  auVar34 = vshufps_avx(auVar43,auVar43,0xff);
  auVar129._0_4_ = auVar34._0_4_ * fVar203 + auVar33._0_4_ * fVar201 * fVar199 * auVar35._0_4_;
  auVar129._4_4_ = auVar34._4_4_ * fVar211 + auVar33._4_4_ * fVar201 * fVar199 * auVar35._4_4_;
  auVar129._8_4_ = auVar34._8_4_ * fVar212 + auVar33._8_4_ * fVar201 * fVar199 * auVar35._8_4_;
  auVar129._12_4_ = auVar34._12_4_ * fVar213 + auVar33._12_4_ * fVar201 * fVar199 * auVar35._12_4_;
  auVar35 = vsubps_avx(auVar43,auVar129);
  local_188._0_4_ = auVar98._0_4_ + auVar149._0_4_;
  local_188._4_4_ = auVar98._4_4_ + auVar149._4_4_;
  fStack_180 = auVar98._8_4_ + auVar149._8_4_;
  fStack_17c = auVar98._12_4_ + auVar149._12_4_;
  auVar89._0_4_ = fVar86 + auVar129._0_4_;
  auVar89._4_4_ = fVar95 + auVar129._4_4_;
  auVar89._8_4_ = fVar96 + auVar129._8_4_;
  auVar89._12_4_ = fVar97 + auVar129._12_4_;
  auVar33 = vshufps_avx(auVar45,auVar45,0xff);
  auVar130._0_4_ = fVar182 * auVar33._0_4_;
  auVar130._4_4_ = fVar194 * auVar33._4_4_;
  auVar130._8_4_ = fVar196 * auVar33._8_4_;
  auVar130._12_4_ = fVar198 * auVar33._12_4_;
  local_198 = vsubps_avx(auVar45,auVar130);
  auVar34 = vshufps_avx(auVar39,auVar39,0xff);
  auVar99._0_4_ = fVar182 * auVar34._0_4_ + auVar33._0_4_ * fVar156 * auVar36._0_4_ * fVar200;
  auVar99._4_4_ = fVar194 * auVar34._4_4_ + auVar33._4_4_ * fVar156 * auVar36._4_4_ * fVar200;
  auVar99._8_4_ = fVar196 * auVar34._8_4_ + auVar33._8_4_ * fVar156 * auVar36._8_4_ * fVar200;
  auVar99._12_4_ = fVar198 * auVar34._12_4_ + auVar33._12_4_ * fVar156 * auVar36._12_4_ * fVar200;
  auVar33 = vsubps_avx(auVar39,auVar99);
  _local_1a8 = vaddps_avx512vl(auVar45,auVar130);
  auVar100._0_4_ = fVar202 + auVar99._0_4_;
  auVar100._4_4_ = fVar183 + auVar99._4_4_;
  auVar100._8_4_ = fVar195 + auVar99._8_4_;
  auVar100._12_4_ = fVar197 + auVar99._12_4_;
  auVar34 = vmulps_avx512vl(auVar35,auVar37);
  local_1b8 = vaddps_avx512vl(local_178,auVar34);
  auVar33 = vmulps_avx512vl(auVar33,auVar37);
  local_1c8 = vsubps_avx512vl(local_198,auVar33);
  auVar33 = vmulps_avx512vl(auVar89,auVar37);
  _local_1d8 = vaddps_avx512vl(_local_188,auVar33);
  auVar33 = vmulps_avx512vl(auVar100,auVar37);
  _local_1e8 = vsubps_avx512vl(_local_1a8,auVar33);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar34 = vsubps_avx(local_178,(undefined1  [16])aVar2);
  uVar87 = auVar34._0_4_;
  auVar101._4_4_ = uVar87;
  auVar101._0_4_ = uVar87;
  auVar101._8_4_ = uVar87;
  auVar101._12_4_ = uVar87;
  auVar33 = vshufps_avx(auVar34,auVar34,0x55);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  aVar3 = (pre->ray_space).vx.field_0;
  aVar4 = (pre->ray_space).vy.field_0;
  fVar202 = (pre->ray_space).vz.field_0.m128[0];
  fVar183 = (pre->ray_space).vz.field_0.m128[1];
  fVar195 = (pre->ray_space).vz.field_0.m128[2];
  fVar197 = (pre->ray_space).vz.field_0.m128[3];
  auVar90._0_4_ = fVar202 * auVar34._0_4_;
  auVar90._4_4_ = fVar183 * auVar34._4_4_;
  auVar90._8_4_ = fVar195 * auVar34._8_4_;
  auVar90._12_4_ = fVar197 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar33);
  auVar42 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar3,auVar101);
  auVar34 = vsubps_avx512vl(local_1b8,(undefined1  [16])aVar2);
  uVar87 = auVar34._0_4_;
  auVar105._4_4_ = uVar87;
  auVar105._0_4_ = uVar87;
  auVar105._8_4_ = uVar87;
  auVar105._12_4_ = uVar87;
  auVar33 = vshufps_avx(auVar34,auVar34,0x55);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  auVar102._0_4_ = fVar202 * auVar34._0_4_;
  auVar102._4_4_ = fVar183 * auVar34._4_4_;
  auVar102._8_4_ = fVar195 * auVar34._8_4_;
  auVar102._12_4_ = fVar197 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar33);
  auVar38 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar3,auVar105);
  auVar34 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar2);
  uVar87 = auVar34._0_4_;
  auVar141._4_4_ = uVar87;
  auVar141._0_4_ = uVar87;
  auVar141._8_4_ = uVar87;
  auVar141._12_4_ = uVar87;
  auVar33 = vshufps_avx(auVar34,auVar34,0x55);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  auVar106._0_4_ = fVar202 * auVar34._0_4_;
  auVar106._4_4_ = fVar183 * auVar34._4_4_;
  auVar106._8_4_ = fVar195 * auVar34._8_4_;
  auVar106._12_4_ = fVar197 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar4,auVar33);
  auVar37 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar3,auVar141);
  auVar34 = vsubps_avx(local_198,(undefined1  [16])aVar2);
  uVar87 = auVar34._0_4_;
  auVar159._4_4_ = uVar87;
  auVar159._0_4_ = uVar87;
  auVar159._8_4_ = uVar87;
  auVar159._12_4_ = uVar87;
  auVar33 = vshufps_avx(auVar34,auVar34,0x55);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  auVar142._0_4_ = fVar202 * auVar34._0_4_;
  auVar142._4_4_ = fVar183 * auVar34._4_4_;
  auVar142._8_4_ = fVar195 * auVar34._8_4_;
  auVar142._12_4_ = fVar197 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar4,auVar33);
  auVar39 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar3,auVar159);
  auVar34 = vsubps_avx(_local_188,(undefined1  [16])aVar2);
  uVar87 = auVar34._0_4_;
  auVar167._4_4_ = uVar87;
  auVar167._0_4_ = uVar87;
  auVar167._8_4_ = uVar87;
  auVar167._12_4_ = uVar87;
  auVar33 = vshufps_avx(auVar34,auVar34,0x55);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  auVar160._0_4_ = auVar34._0_4_ * fVar202;
  auVar160._4_4_ = auVar34._4_4_ * fVar183;
  auVar160._8_4_ = auVar34._8_4_ * fVar195;
  auVar160._12_4_ = auVar34._12_4_ * fVar197;
  auVar33 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar4,auVar33);
  auVar40 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar3,auVar167);
  auVar34 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar2);
  uVar87 = auVar34._0_4_;
  auVar177._4_4_ = uVar87;
  auVar177._0_4_ = uVar87;
  auVar177._8_4_ = uVar87;
  auVar177._12_4_ = uVar87;
  auVar33 = vshufps_avx(auVar34,auVar34,0x55);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  auVar168._0_4_ = auVar34._0_4_ * fVar202;
  auVar168._4_4_ = auVar34._4_4_ * fVar183;
  auVar168._8_4_ = auVar34._8_4_ * fVar195;
  auVar168._12_4_ = auVar34._12_4_ * fVar197;
  auVar33 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar4,auVar33);
  auVar41 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar3,auVar177);
  auVar34 = vsubps_avx512vl(_local_1e8,(undefined1  [16])aVar2);
  uVar87 = auVar34._0_4_;
  auVar184._4_4_ = uVar87;
  auVar184._0_4_ = uVar87;
  auVar184._8_4_ = uVar87;
  auVar184._12_4_ = uVar87;
  auVar33 = vshufps_avx(auVar34,auVar34,0x55);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  auVar178._0_4_ = auVar34._0_4_ * fVar202;
  auVar178._4_4_ = auVar34._4_4_ * fVar183;
  auVar178._8_4_ = auVar34._8_4_ * fVar195;
  auVar178._12_4_ = auVar34._12_4_ * fVar197;
  auVar33 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar4,auVar33);
  auVar43 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar3,auVar184);
  auVar34 = vsubps_avx512vl(_local_1a8,(undefined1  [16])aVar2);
  uVar87 = auVar34._0_4_;
  auVar185._4_4_ = uVar87;
  auVar185._0_4_ = uVar87;
  auVar185._8_4_ = uVar87;
  auVar185._12_4_ = uVar87;
  auVar33 = vshufps_avx(auVar34,auVar34,0x55);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  auVar121._0_4_ = fVar202 * auVar34._0_4_;
  auVar121._4_4_ = fVar183 * auVar34._4_4_;
  auVar121._8_4_ = fVar195 * auVar34._8_4_;
  auVar121._12_4_ = fVar197 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar4,auVar33);
  auVar44 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar3,auVar185);
  local_268 = vmovlhps_avx(auVar42,auVar40);
  local_278 = vmovlhps_avx512f(auVar38,auVar41);
  local_288 = vmovlhps_avx512f(auVar37,auVar43);
  _local_f8 = vmovlhps_avx512f(auVar39,auVar44);
  auVar33 = vminps_avx512vl(local_268,local_278);
  auVar35 = vmaxps_avx512vl(local_268,local_278);
  auVar34 = vminps_avx512vl(local_288,_local_f8);
  auVar34 = vminps_avx(auVar33,auVar34);
  auVar33 = vmaxps_avx512vl(local_288,_local_f8);
  auVar33 = vmaxps_avx(auVar35,auVar33);
  auVar35 = vshufpd_avx(auVar34,auVar34,3);
  auVar36 = vshufpd_avx(auVar33,auVar33,3);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar33 = vmaxps_avx(auVar33,auVar36);
  auVar34 = vandps_avx512vl(auVar34,auVar233._0_16_);
  auVar33 = vandps_avx512vl(auVar33,auVar233._0_16_);
  auVar33 = vmaxps_avx(auVar34,auVar33);
  auVar34 = vmovshdup_avx(auVar33);
  auVar33 = vmaxss_avx(auVar34,auVar33);
  local_318 = uVar27 + 0xf;
  local_298._8_8_ = auVar42._0_8_;
  local_298._0_8_ = auVar42._0_8_;
  local_2a8._8_8_ = auVar38._0_8_;
  local_2a8._0_8_ = auVar38._0_8_;
  local_2b8 = vmovddup_avx512vl(auVar37);
  local_2c8 = vmovddup_avx512vl(auVar39);
  register0x00001348 = auVar40._0_8_;
  local_2d8 = auVar40._0_8_;
  register0x00001388 = auVar41._0_8_;
  local_2e8 = auVar41._0_8_;
  register0x00001408 = auVar43._0_8_;
  local_2f8 = auVar43._0_8_;
  register0x00001448 = auVar44._0_8_;
  local_308 = auVar44._0_8_;
  local_108 = ZEXT416((uint)(auVar33._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_108);
  auVar12._8_4_ = 0x80000000;
  auVar12._0_8_ = 0x8000000080000000;
  auVar12._12_4_ = 0x80000000;
  auVar33 = vxorps_avx512vl(local_b8._0_16_,auVar12);
  local_78 = auVar33._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  local_c8 = vsubps_avx512vl(local_278,local_268);
  local_d8 = vsubps_avx512vl(local_288,local_278);
  local_e8 = vsubps_avx512vl(_local_f8,local_288);
  local_118 = vsubps_avx(_local_188,local_178);
  local_128 = vsubps_avx512vl(_local_1d8,local_1b8);
  local_138 = vsubps_avx512vl(_local_1e8,local_1c8);
  _local_148 = vsubps_avx512vl(_local_1a8,local_198);
  uVar22 = 0;
  auVar33 = ZEXT816(0x3f80000000000000);
  auVar103 = auVar33;
LAB_017d84f5:
  auVar236 = ZEXT3264(local_b8);
  auVar34 = vshufps_avx(auVar103,auVar103,0x50);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar222._16_4_ = 0x3f800000;
  auVar222._0_16_ = auVar219;
  auVar222._20_4_ = 0x3f800000;
  auVar222._24_4_ = 0x3f800000;
  auVar222._28_4_ = 0x3f800000;
  auVar35 = vsubps_avx(auVar219,auVar34);
  fVar202 = auVar34._0_4_;
  auVar122._0_4_ = local_2d8._0_4_ * fVar202;
  fVar183 = auVar34._4_4_;
  auVar122._4_4_ = local_2d8._4_4_ * fVar183;
  fVar195 = auVar34._8_4_;
  auVar122._8_4_ = local_2d8._8_4_ * fVar195;
  fVar197 = auVar34._12_4_;
  auVar122._12_4_ = local_2d8._12_4_ * fVar197;
  auVar131._0_4_ = local_2e8._0_4_ * fVar202;
  auVar131._4_4_ = local_2e8._4_4_ * fVar183;
  auVar131._8_4_ = local_2e8._8_4_ * fVar195;
  auVar131._12_4_ = local_2e8._12_4_ * fVar197;
  auVar143._0_4_ = local_2f8._0_4_ * fVar202;
  auVar143._4_4_ = local_2f8._4_4_ * fVar183;
  auVar143._8_4_ = local_2f8._8_4_ * fVar195;
  auVar143._12_4_ = local_2f8._12_4_ * fVar197;
  auVar107._0_4_ = local_308._0_4_ * fVar202;
  auVar107._4_4_ = local_308._4_4_ * fVar183;
  auVar107._8_4_ = local_308._8_4_ * fVar195;
  auVar107._12_4_ = local_308._12_4_ * fVar197;
  auVar36 = vfmadd231ps_fma(auVar122,auVar35,local_298);
  auVar42 = vfmadd231ps_fma(auVar131,auVar35,local_2a8);
  auVar38 = vfmadd231ps_avx512vl(auVar143,auVar35,local_2b8);
  auVar35 = vfmadd231ps_avx512vl(auVar107,local_2c8,auVar35);
  auVar34 = vmovshdup_avx(auVar33);
  fVar183 = auVar33._0_4_;
  fVar202 = (auVar34._0_4_ - fVar183) * 0.04761905;
  auVar67._4_4_ = fVar183;
  auVar67._0_4_ = fVar183;
  auVar67._8_4_ = fVar183;
  auVar67._12_4_ = fVar183;
  auVar67._16_4_ = fVar183;
  auVar67._20_4_ = fVar183;
  auVar67._24_4_ = fVar183;
  auVar67._28_4_ = fVar183;
  auVar62._0_8_ = auVar34._0_8_;
  auVar62._8_8_ = auVar62._0_8_;
  auVar62._16_8_ = auVar62._0_8_;
  auVar62._24_8_ = auVar62._0_8_;
  auVar70 = vsubps_avx(auVar62,auVar67);
  uVar87 = auVar36._0_4_;
  auVar72._4_4_ = uVar87;
  auVar72._0_4_ = uVar87;
  auVar72._8_4_ = uVar87;
  auVar72._12_4_ = uVar87;
  auVar72._16_4_ = uVar87;
  auVar72._20_4_ = uVar87;
  auVar72._24_4_ = uVar87;
  auVar72._28_4_ = uVar87;
  auVar125._8_4_ = 1;
  auVar125._0_8_ = 0x100000001;
  auVar125._12_4_ = 1;
  auVar125._16_4_ = 1;
  auVar125._20_4_ = 1;
  auVar125._24_4_ = 1;
  auVar125._28_4_ = 1;
  auVar69 = ZEXT1632(auVar36);
  auVar68 = vpermps_avx2(auVar125,auVar69);
  auVar53 = vbroadcastss_avx512vl(auVar42);
  auVar63 = ZEXT1632(auVar42);
  auVar54 = vpermps_avx512vl(auVar125,auVar63);
  auVar55 = vbroadcastss_avx512vl(auVar38);
  auVar64 = ZEXT1632(auVar38);
  auVar56 = vpermps_avx512vl(auVar125,auVar64);
  auVar57 = vbroadcastss_avx512vl(auVar35);
  auVar66 = ZEXT1632(auVar35);
  auVar58 = vpermps_avx512vl(auVar125,auVar66);
  auVar137._4_4_ = fVar202;
  auVar137._0_4_ = fVar202;
  auVar137._8_4_ = fVar202;
  auVar137._12_4_ = fVar202;
  auVar137._16_4_ = fVar202;
  auVar137._20_4_ = fVar202;
  auVar137._24_4_ = fVar202;
  auVar137._28_4_ = fVar202;
  auVar65._8_4_ = 2;
  auVar65._0_8_ = 0x200000002;
  auVar65._12_4_ = 2;
  auVar65._16_4_ = 2;
  auVar65._20_4_ = 2;
  auVar65._24_4_ = 2;
  auVar65._28_4_ = 2;
  auVar59 = vpermps_avx512vl(auVar65,auVar69);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar61 = vpermps_avx512vl(auVar60,auVar69);
  auVar62 = vpermps_avx512vl(auVar65,auVar63);
  auVar63 = vpermps_avx512vl(auVar60,auVar63);
  auVar69 = vpermps_avx2(auVar65,auVar64);
  auVar64 = vpermps_avx512vl(auVar60,auVar64);
  auVar65 = vpermps_avx512vl(auVar65,auVar66);
  auVar66 = vpermps_avx512vl(auVar60,auVar66);
  auVar34 = vfmadd132ps_fma(auVar70,auVar67,_DAT_01f7b040);
  auVar70 = vsubps_avx(auVar222,ZEXT1632(auVar34));
  auVar60 = vmulps_avx512vl(auVar53,ZEXT1632(auVar34));
  auVar71 = ZEXT1632(auVar34);
  auVar67 = vmulps_avx512vl(auVar54,auVar71);
  auVar35 = vfmadd231ps_fma(auVar60,auVar70,auVar72);
  auVar36 = vfmadd231ps_fma(auVar67,auVar70,auVar68);
  auVar60 = vmulps_avx512vl(auVar55,auVar71);
  auVar67 = vmulps_avx512vl(auVar56,auVar71);
  auVar53 = vfmadd231ps_avx512vl(auVar60,auVar70,auVar53);
  auVar54 = vfmadd231ps_avx512vl(auVar67,auVar70,auVar54);
  auVar60 = vmulps_avx512vl(auVar57,auVar71);
  auVar72 = ZEXT1632(auVar34);
  auVar58 = vmulps_avx512vl(auVar58,auVar72);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar70,auVar55);
  auVar67 = vfmadd231ps_avx512vl(auVar58,auVar70,auVar56);
  fVar195 = auVar34._0_4_;
  fVar197 = auVar34._4_4_;
  auVar55._4_4_ = fVar197 * auVar53._4_4_;
  auVar55._0_4_ = fVar195 * auVar53._0_4_;
  fVar199 = auVar34._8_4_;
  auVar55._8_4_ = fVar199 * auVar53._8_4_;
  fVar200 = auVar34._12_4_;
  auVar55._12_4_ = fVar200 * auVar53._12_4_;
  auVar55._16_4_ = auVar53._16_4_ * 0.0;
  auVar55._20_4_ = auVar53._20_4_ * 0.0;
  auVar55._24_4_ = auVar53._24_4_ * 0.0;
  auVar55._28_4_ = fVar183;
  auVar56._4_4_ = fVar197 * auVar54._4_4_;
  auVar56._0_4_ = fVar195 * auVar54._0_4_;
  auVar56._8_4_ = fVar199 * auVar54._8_4_;
  auVar56._12_4_ = fVar200 * auVar54._12_4_;
  auVar56._16_4_ = auVar54._16_4_ * 0.0;
  auVar56._20_4_ = auVar54._20_4_ * 0.0;
  auVar56._24_4_ = auVar54._24_4_ * 0.0;
  auVar56._28_4_ = auVar68._28_4_;
  auVar35 = vfmadd231ps_fma(auVar55,auVar70,ZEXT1632(auVar35));
  auVar36 = vfmadd231ps_fma(auVar56,auVar70,ZEXT1632(auVar36));
  auVar71._0_4_ = fVar195 * auVar60._0_4_;
  auVar71._4_4_ = fVar197 * auVar60._4_4_;
  auVar71._8_4_ = fVar199 * auVar60._8_4_;
  auVar71._12_4_ = fVar200 * auVar60._12_4_;
  auVar71._16_4_ = auVar60._16_4_ * 0.0;
  auVar71._20_4_ = auVar60._20_4_ * 0.0;
  auVar71._24_4_ = auVar60._24_4_ * 0.0;
  auVar71._28_4_ = 0;
  auVar58._4_4_ = fVar197 * auVar67._4_4_;
  auVar58._0_4_ = fVar195 * auVar67._0_4_;
  auVar58._8_4_ = fVar199 * auVar67._8_4_;
  auVar58._12_4_ = fVar200 * auVar67._12_4_;
  auVar58._16_4_ = auVar67._16_4_ * 0.0;
  auVar58._20_4_ = auVar67._20_4_ * 0.0;
  auVar58._24_4_ = auVar67._24_4_ * 0.0;
  auVar58._28_4_ = auVar60._28_4_;
  auVar42 = vfmadd231ps_fma(auVar71,auVar70,auVar53);
  auVar38 = vfmadd231ps_fma(auVar58,auVar70,auVar54);
  auVar60._28_4_ = auVar54._28_4_;
  auVar60._0_28_ =
       ZEXT1628(CONCAT412(fVar200 * auVar38._12_4_,
                          CONCAT48(fVar199 * auVar38._8_4_,
                                   CONCAT44(fVar197 * auVar38._4_4_,fVar195 * auVar38._0_4_))));
  auVar37 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar42._12_4_,
                                               CONCAT48(fVar199 * auVar42._8_4_,
                                                        CONCAT44(fVar197 * auVar42._4_4_,
                                                                 fVar195 * auVar42._0_4_)))),auVar70
                            ,ZEXT1632(auVar35));
  auVar39 = vfmadd231ps_fma(auVar60,auVar70,ZEXT1632(auVar36));
  auVar68 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar35));
  auVar53 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar36));
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar68 = vmulps_avx512vl(auVar68,auVar54);
  auVar53 = vmulps_avx512vl(auVar53,auVar54);
  auVar73._0_4_ = fVar202 * auVar68._0_4_;
  auVar73._4_4_ = fVar202 * auVar68._4_4_;
  auVar73._8_4_ = fVar202 * auVar68._8_4_;
  auVar73._12_4_ = fVar202 * auVar68._12_4_;
  auVar73._16_4_ = fVar202 * auVar68._16_4_;
  auVar73._20_4_ = fVar202 * auVar68._20_4_;
  auVar73._24_4_ = fVar202 * auVar68._24_4_;
  auVar73._28_4_ = 0;
  auVar68 = vmulps_avx512vl(auVar137,auVar53);
  auVar36 = vxorps_avx512vl(auVar57._0_16_,auVar57._0_16_);
  auVar55 = vpermt2ps_avx512vl(ZEXT1632(auVar37),_DAT_01fb9fc0,ZEXT1632(auVar36));
  auVar56 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_01fb9fc0,ZEXT1632(auVar36));
  auVar112._0_4_ = auVar73._0_4_ + auVar37._0_4_;
  auVar112._4_4_ = auVar73._4_4_ + auVar37._4_4_;
  auVar112._8_4_ = auVar73._8_4_ + auVar37._8_4_;
  auVar112._12_4_ = auVar73._12_4_ + auVar37._12_4_;
  auVar112._16_4_ = auVar73._16_4_ + 0.0;
  auVar112._20_4_ = auVar73._20_4_ + 0.0;
  auVar112._24_4_ = auVar73._24_4_ + 0.0;
  auVar112._28_4_ = 0;
  auVar67 = ZEXT1632(auVar36);
  auVar53 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,auVar67);
  auVar58 = vaddps_avx512vl(ZEXT1632(auVar39),auVar68);
  auVar60 = vpermt2ps_avx512vl(auVar68,_DAT_01fb9fc0,auVar67);
  auVar68 = vsubps_avx(auVar55,auVar53);
  auVar60 = vsubps_avx512vl(auVar56,auVar60);
  auVar53 = vmulps_avx512vl(auVar62,auVar72);
  auVar57 = vmulps_avx512vl(auVar63,auVar72);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar70,auVar59);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar70,auVar61);
  auVar59 = vmulps_avx512vl(auVar69,auVar72);
  auVar61 = vmulps_avx512vl(auVar64,auVar72);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar70,auVar62);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar70,auVar63);
  auVar62 = vmulps_avx512vl(auVar65,auVar72);
  auVar63 = vmulps_avx512vl(auVar66,auVar72);
  auVar35 = vfmadd231ps_fma(auVar62,auVar70,auVar69);
  auVar69 = vfmadd231ps_avx512vl(auVar63,auVar70,auVar64);
  auVar62 = vmulps_avx512vl(auVar72,auVar59);
  auVar65 = ZEXT1632(auVar34);
  auVar63 = vmulps_avx512vl(auVar65,auVar61);
  auVar53 = vfmadd231ps_avx512vl(auVar62,auVar70,auVar53);
  auVar62 = vfmadd231ps_avx512vl(auVar63,auVar70,auVar57);
  auVar69 = vmulps_avx512vl(auVar65,auVar69);
  auVar59 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar200 * auVar35._12_4_,
                                          CONCAT48(fVar199 * auVar35._8_4_,
                                                   CONCAT44(fVar197 * auVar35._4_4_,
                                                            fVar195 * auVar35._0_4_)))),auVar70,
                       auVar59);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar70,auVar61);
  auVar57._4_4_ = fVar197 * auVar59._4_4_;
  auVar57._0_4_ = fVar195 * auVar59._0_4_;
  auVar57._8_4_ = fVar199 * auVar59._8_4_;
  auVar57._12_4_ = fVar200 * auVar59._12_4_;
  auVar57._16_4_ = auVar59._16_4_ * 0.0;
  auVar57._20_4_ = auVar59._20_4_ * 0.0;
  auVar57._24_4_ = auVar59._24_4_ * 0.0;
  auVar57._28_4_ = auVar64._28_4_;
  auVar61 = vmulps_avx512vl(auVar65,auVar69);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar70,auVar53);
  auVar63 = vfmadd231ps_avx512vl(auVar61,auVar62,auVar70);
  auVar70 = vsubps_avx512vl(auVar59,auVar53);
  auVar53 = vsubps_avx512vl(auVar69,auVar62);
  auVar70 = vmulps_avx512vl(auVar70,auVar54);
  auVar53 = vmulps_avx512vl(auVar53,auVar54);
  fVar183 = fVar202 * auVar70._0_4_;
  fVar195 = fVar202 * auVar70._4_4_;
  auVar59._4_4_ = fVar195;
  auVar59._0_4_ = fVar183;
  fVar197 = fVar202 * auVar70._8_4_;
  auVar59._8_4_ = fVar197;
  fVar199 = fVar202 * auVar70._12_4_;
  auVar59._12_4_ = fVar199;
  fVar200 = fVar202 * auVar70._16_4_;
  auVar59._16_4_ = fVar200;
  fVar201 = fVar202 * auVar70._20_4_;
  auVar59._20_4_ = fVar201;
  fVar202 = fVar202 * auVar70._24_4_;
  auVar59._24_4_ = fVar202;
  auVar59._28_4_ = auVar70._28_4_;
  auVar53 = vmulps_avx512vl(auVar137,auVar53);
  auVar69 = vpermt2ps_avx512vl(auVar57,_DAT_01fb9fc0,auVar67);
  auVar54 = vpermt2ps_avx512vl(auVar63,_DAT_01fb9fc0,auVar67);
  auVar181._0_4_ = auVar57._0_4_ + fVar183;
  auVar181._4_4_ = auVar57._4_4_ + fVar195;
  auVar181._8_4_ = auVar57._8_4_ + fVar197;
  auVar181._12_4_ = auVar57._12_4_ + fVar199;
  auVar181._16_4_ = auVar57._16_4_ + fVar200;
  auVar181._20_4_ = auVar57._20_4_ + fVar201;
  auVar181._24_4_ = auVar57._24_4_ + fVar202;
  auVar181._28_4_ = auVar57._28_4_ + auVar70._28_4_;
  auVar70 = vpermt2ps_avx512vl(auVar59,_DAT_01fb9fc0,ZEXT1632(auVar36));
  auVar59 = vaddps_avx512vl(auVar63,auVar53);
  auVar61 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9fc0,ZEXT1632(auVar36));
  auVar53 = vsubps_avx(auVar69,auVar70);
  auVar62 = vsubps_avx512vl(auVar54,auVar61);
  in_ZMM17 = ZEXT3264(auVar62);
  auVar125 = ZEXT1632(auVar37);
  auVar70 = vsubps_avx512vl(auVar57,auVar125);
  auVar137 = ZEXT1632(auVar39);
  auVar61 = vsubps_avx512vl(auVar63,auVar137);
  auVar64 = vsubps_avx512vl(auVar69,auVar55);
  auVar70 = vaddps_avx512vl(auVar70,auVar64);
  auVar64 = vsubps_avx512vl(auVar54,auVar56);
  auVar61 = vaddps_avx512vl(auVar61,auVar64);
  auVar64 = vmulps_avx512vl(auVar137,auVar70);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar125,auVar61);
  auVar65 = vmulps_avx512vl(auVar58,auVar70);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar112,auVar61);
  auVar66 = vmulps_avx512vl(auVar60,auVar70);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar68,auVar61);
  auVar67 = vmulps_avx512vl(auVar56,auVar70);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar55,auVar61);
  auVar71 = vmulps_avx512vl(auVar63,auVar70);
  auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar57,auVar61);
  auVar72 = vmulps_avx512vl(auVar59,auVar70);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar181,auVar61);
  auVar73 = vmulps_avx512vl(auVar62,auVar70);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar53,auVar61);
  auVar70 = vmulps_avx512vl(auVar54,auVar70);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar69,auVar61);
  auVar61 = vminps_avx512vl(auVar64,auVar65);
  auVar64 = vmaxps_avx512vl(auVar64,auVar65);
  auVar65 = vminps_avx512vl(auVar66,auVar67);
  auVar61 = vminps_avx512vl(auVar61,auVar65);
  auVar65 = vmaxps_avx512vl(auVar66,auVar67);
  auVar64 = vmaxps_avx512vl(auVar64,auVar65);
  auVar65 = vminps_avx512vl(auVar71,auVar72);
  auVar66 = vmaxps_avx512vl(auVar71,auVar72);
  auVar67 = vminps_avx512vl(auVar73,auVar70);
  auVar65 = vminps_avx512vl(auVar65,auVar67);
  auVar61 = vminps_avx512vl(auVar61,auVar65);
  auVar70 = vmaxps_avx512vl(auVar73,auVar70);
  auVar70 = vmaxps_avx512vl(auVar66,auVar70);
  auVar70 = vmaxps_avx512vl(auVar64,auVar70);
  auVar229 = ZEXT3264(auVar70);
  uVar10 = vcmpps_avx512vl(auVar61,local_b8,2);
  auVar61._4_4_ = uStack_74;
  auVar61._0_4_ = local_78;
  auVar61._8_4_ = uStack_70;
  auVar61._12_4_ = uStack_6c;
  auVar61._16_4_ = uStack_68;
  auVar61._20_4_ = uStack_64;
  auVar61._24_4_ = uStack_60;
  auVar61._28_4_ = uStack_5c;
  uVar11 = vcmpps_avx512vl(auVar70,auVar61,5);
  bVar20 = (byte)uVar10 & (byte)uVar11 & 0x7f;
  auVar70 = _DAT_01fb9fe0;
  if (bVar20 == 0) {
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT3264(auVar68);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar231 = ZEXT1664(auVar33);
    auVar232 = ZEXT3264(_DAT_01fb9fe0);
  }
  else {
    auVar64 = vsubps_avx512vl(auVar55,auVar125);
    auVar65 = vsubps_avx512vl(auVar56,auVar137);
    auVar66 = vsubps_avx512vl(auVar69,auVar57);
    auVar64 = vaddps_avx512vl(auVar64,auVar66);
    auVar229 = ZEXT3264(auVar64);
    auVar66 = vsubps_avx512vl(auVar54,auVar63);
    auVar65 = vaddps_avx512vl(auVar65,auVar66);
    auVar66 = vmulps_avx512vl(auVar137,auVar64);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar65,auVar125);
    auVar58 = vmulps_avx512vl(auVar58,auVar64);
    auVar58 = vfnmadd213ps_avx512vl(auVar112,auVar65,auVar58);
    auVar60 = vmulps_avx512vl(auVar60,auVar64);
    auVar60 = vfnmadd213ps_avx512vl(auVar68,auVar65,auVar60);
    auVar68 = vmulps_avx512vl(auVar56,auVar64);
    auVar55 = vfnmadd231ps_avx512vl(auVar68,auVar65,auVar55);
    auVar68 = vmulps_avx512vl(auVar63,auVar64);
    auVar56 = vfnmadd231ps_avx512vl(auVar68,auVar65,auVar57);
    auVar68 = vmulps_avx512vl(auVar59,auVar64);
    auVar57 = vfnmadd213ps_avx512vl(auVar181,auVar65,auVar68);
    auVar68 = vmulps_avx512vl(auVar62,auVar64);
    auVar59 = vfnmadd213ps_avx512vl(auVar53,auVar65,auVar68);
    auVar68 = vmulps_avx512vl(auVar54,auVar64);
    auVar62 = vfnmadd231ps_avx512vl(auVar68,auVar69,auVar65);
    auVar53 = vminps_avx(auVar66,auVar58);
    auVar68 = vmaxps_avx(auVar66,auVar58);
    auVar69 = vminps_avx(auVar60,auVar55);
    auVar69 = vminps_avx(auVar53,auVar69);
    auVar53 = vmaxps_avx(auVar60,auVar55);
    auVar68 = vmaxps_avx(auVar68,auVar53);
    auVar54 = vminps_avx(auVar56,auVar57);
    auVar53 = vmaxps_avx(auVar56,auVar57);
    auVar55 = vminps_avx(auVar59,auVar62);
    auVar54 = vminps_avx(auVar54,auVar55);
    auVar54 = vminps_avx(auVar69,auVar54);
    auVar69 = vmaxps_avx(auVar59,auVar62);
    auVar53 = vmaxps_avx(auVar53,auVar69);
    auVar68 = vmaxps_avx(auVar68,auVar53);
    uVar10 = vcmpps_avx512vl(auVar68,auVar61,5);
    uVar11 = vcmpps_avx512vl(auVar54,local_b8,2);
    bVar20 = bVar20 & (byte)uVar10 & (byte)uVar11;
    if (bVar20 != 0) {
      auStack_168[uVar22] = (uint)bVar20;
      uVar10 = vmovlps_avx(auVar33);
      (&uStack_98)[uVar22] = uVar10;
      uVar1 = vmovlps_avx(auVar103);
      auStack_58[uVar22] = uVar1;
      uVar22 = (ulong)((int)uVar22 + 1);
    }
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT3264(auVar68);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar231 = ZEXT1664(auVar33);
    auVar232 = ZEXT3264(_DAT_01fb9fe0);
  }
LAB_017d8a3b:
  do {
    do {
      do {
        auVar35 = auVar234._0_16_;
        auVar36 = auVar237._0_16_;
        auVar34 = SUB6416(ZEXT464(0xb8d1b717),0);
        if ((int)uVar22 == 0) {
          fVar202 = (ray->super_RayK<1>).tfar;
          auVar18._4_4_ = fVar202;
          auVar18._0_4_ = fVar202;
          auVar18._8_4_ = fVar202;
          auVar18._12_4_ = fVar202;
          uVar10 = vcmpps_avx512vl(local_158,auVar18,2);
          uVar27 = (ulong)((uint)uVar27 & (uint)local_318 & (uint)uVar10);
          goto LAB_017d7e73;
        }
        uVar21 = (int)uVar22 - 1;
        uVar23 = (ulong)uVar21;
        uVar5 = auStack_168[uVar23];
        auVar103._8_8_ = 0;
        auVar103._0_8_ = auStack_58[uVar23];
        uVar1 = 0;
        for (uVar26 = (ulong)uVar5; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        uVar25 = uVar5 - 1 & uVar5;
        bVar30 = uVar25 == 0;
        auStack_168[uVar23] = uVar25;
        if (bVar30) {
          uVar22 = (ulong)uVar21;
        }
        auVar91._8_8_ = 0;
        auVar91._0_8_ = uVar1;
        auVar33 = vpunpcklqdq_avx(auVar91,ZEXT416((int)uVar1 + 1));
        auVar33 = vcvtqq2ps_avx512vl(auVar33);
        auVar33 = vmulps_avx512vl(auVar33,auVar231._0_16_);
        uVar87 = *(undefined4 *)((long)&uStack_98 + uVar23 * 8 + 4);
        auVar13._4_4_ = uVar87;
        auVar13._0_4_ = uVar87;
        auVar13._8_4_ = uVar87;
        auVar13._12_4_ = uVar87;
        auVar42 = vmulps_avx512vl(auVar33,auVar13);
        auVar33 = vsubps_avx512vl(auVar35,auVar33);
        uVar87 = *(undefined4 *)(&uStack_98 + uVar23);
        auVar14._4_4_ = uVar87;
        auVar14._0_4_ = uVar87;
        auVar14._8_4_ = uVar87;
        auVar14._12_4_ = uVar87;
        auVar33 = vfmadd231ps_avx512vl(auVar42,auVar33,auVar14);
        auVar42 = vmovshdup_avx(auVar33);
        fVar202 = auVar42._0_4_ - auVar33._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        if (uVar5 == 0 || bVar30) goto LAB_017d84f5;
        auVar42 = vshufps_avx(auVar103,auVar103,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        bVar28 = (uint)uVar22 < 4;
        uVar21 = (uint)uVar22 - 4;
        bVar31 = uVar21 == 0;
        bVar29 = (POPCOUNT(uVar21 & 0xff) & 1U) == 0;
        auVar39 = vsubps_avx512vl(auVar35,auVar42);
        fVar183 = auVar42._0_4_;
        auVar132._0_4_ = fVar183 * (float)local_2d8._0_4_;
        fVar195 = auVar42._4_4_;
        auVar132._4_4_ = fVar195 * (float)local_2d8._4_4_;
        fVar197 = auVar42._8_4_;
        auVar132._8_4_ = fVar197 * fStack_2d0;
        fVar199 = auVar42._12_4_;
        auVar132._12_4_ = fVar199 * fStack_2cc;
        auVar144._0_4_ = fVar183 * (float)local_2e8._0_4_;
        auVar144._4_4_ = fVar195 * (float)local_2e8._4_4_;
        auVar144._8_4_ = fVar197 * fStack_2e0;
        auVar144._12_4_ = fVar199 * fStack_2dc;
        auVar150._0_4_ = fVar183 * (float)local_2f8._0_4_;
        auVar150._4_4_ = fVar195 * (float)local_2f8._4_4_;
        auVar150._8_4_ = fVar197 * fStack_2f0;
        auVar150._12_4_ = fVar199 * fStack_2ec;
        auVar114._0_4_ = fVar183 * (float)local_308._0_4_;
        auVar114._4_4_ = fVar195 * (float)local_308._4_4_;
        auVar114._8_4_ = fVar197 * fStack_300;
        auVar114._12_4_ = fVar199 * fStack_2fc;
        auVar42 = vfmadd231ps_fma(auVar132,auVar39,local_298);
        auVar38 = vfmadd231ps_fma(auVar144,auVar39,local_2a8);
        auVar37 = vfmadd231ps_fma(auVar150,auVar39,local_2b8);
        auVar39 = vfmadd231ps_fma(auVar114,auVar39,local_2c8);
        auVar63._16_16_ = auVar42;
        auVar63._0_16_ = auVar42;
        auVar64._16_16_ = auVar38;
        auVar64._0_16_ = auVar38;
        auVar148._16_16_ = auVar37;
        auVar148._0_16_ = auVar37;
        auVar68 = vpermps_avx512vl(auVar232._0_32_,ZEXT1632(auVar33));
        auVar70 = vsubps_avx(auVar64,auVar63);
        auVar38 = vfmadd213ps_fma(auVar70,auVar68,auVar63);
        auVar70 = vsubps_avx(auVar148,auVar64);
        auVar40 = vfmadd213ps_fma(auVar70,auVar68,auVar64);
        auVar42 = vsubps_avx(auVar39,auVar37);
        auVar66._16_16_ = auVar42;
        auVar66._0_16_ = auVar42;
        auVar42 = vfmadd213ps_fma(auVar66,auVar68,auVar148);
        auVar70 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar38));
        auVar38 = vfmadd213ps_fma(auVar70,auVar68,ZEXT1632(auVar38));
        auVar70 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar40));
        auVar42 = vfmadd213ps_fma(auVar70,auVar68,ZEXT1632(auVar40));
        auVar70 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar38));
        auVar52 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar70,auVar68);
        auVar70 = vmulps_avx512vl(auVar70,auVar230._0_32_);
        auVar42 = vmulss_avx512f(ZEXT416((uint)fVar202),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar183 = auVar42._0_4_;
        auVar151._0_8_ =
             CONCAT44(auVar52._4_4_ + fVar183 * auVar70._4_4_,
                      auVar52._0_4_ + fVar183 * auVar70._0_4_);
        auVar151._8_4_ = auVar52._8_4_ + fVar183 * auVar70._8_4_;
        auVar151._12_4_ = auVar52._12_4_ + fVar183 * auVar70._12_4_;
        auVar133._0_4_ = fVar183 * auVar70._16_4_;
        auVar133._4_4_ = fVar183 * auVar70._20_4_;
        auVar133._8_4_ = fVar183 * auVar70._24_4_;
        auVar133._12_4_ = fVar183 * auVar70._28_4_;
        auVar45 = vsubps_avx((undefined1  [16])0x0,auVar133);
        auVar40 = vshufpd_avx(auVar52,auVar52,3);
        auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar42 = vsubps_avx(auVar40,auVar52);
        auVar38 = vsubps_avx(auVar41,(undefined1  [16])0x0);
        auVar169._0_4_ = auVar42._0_4_ + auVar38._0_4_;
        auVar169._4_4_ = auVar42._4_4_ + auVar38._4_4_;
        auVar169._8_4_ = auVar42._8_4_ + auVar38._8_4_;
        auVar169._12_4_ = auVar42._12_4_ + auVar38._12_4_;
        auVar42 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar38 = vshufps_avx(auVar151,auVar151,0xb1);
        auVar37 = vshufps_avx(auVar45,auVar45,0xb1);
        auVar39 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar220._4_4_ = auVar169._0_4_;
        auVar220._0_4_ = auVar169._0_4_;
        auVar220._8_4_ = auVar169._0_4_;
        auVar220._12_4_ = auVar169._0_4_;
        auVar43 = vshufps_avx(auVar169,auVar169,0x55);
        fVar183 = auVar43._0_4_;
        auVar179._0_4_ = auVar42._0_4_ * fVar183;
        fVar195 = auVar43._4_4_;
        auVar179._4_4_ = auVar42._4_4_ * fVar195;
        fVar197 = auVar43._8_4_;
        auVar179._8_4_ = auVar42._8_4_ * fVar197;
        fVar199 = auVar43._12_4_;
        auVar179._12_4_ = auVar42._12_4_ * fVar199;
        auVar186._0_4_ = auVar38._0_4_ * fVar183;
        auVar186._4_4_ = auVar38._4_4_ * fVar195;
        auVar186._8_4_ = auVar38._8_4_ * fVar197;
        auVar186._12_4_ = auVar38._12_4_ * fVar199;
        auVar205._0_4_ = auVar37._0_4_ * fVar183;
        auVar205._4_4_ = auVar37._4_4_ * fVar195;
        auVar205._8_4_ = auVar37._8_4_ * fVar197;
        auVar205._12_4_ = auVar37._12_4_ * fVar199;
        auVar170._0_4_ = auVar39._0_4_ * fVar183;
        auVar170._4_4_ = auVar39._4_4_ * fVar195;
        auVar170._8_4_ = auVar39._8_4_ * fVar197;
        auVar170._12_4_ = auVar39._12_4_ * fVar199;
        auVar42 = vfmadd231ps_fma(auVar179,auVar220,auVar52);
        auVar38 = vfmadd231ps_fma(auVar186,auVar220,auVar151);
        auVar48 = vfmadd231ps_fma(auVar205,auVar220,auVar45);
        auVar88 = vfmadd231ps_fma(auVar170,(undefined1  [16])0x0,auVar220);
        auVar43 = vshufpd_avx(auVar42,auVar42,1);
        auVar44 = vshufpd_avx(auVar38,auVar38,1);
        auVar46 = vshufpd_avx512vl(auVar48,auVar48,1);
        auVar47 = vshufpd_avx512vl(auVar88,auVar88,1);
        in_ZMM17 = ZEXT1664(auVar47);
        auVar37 = vminss_avx(auVar42,auVar38);
        auVar42 = vmaxss_avx(auVar38,auVar42);
        auVar39 = vminss_avx(auVar48,auVar88);
        auVar38 = vmaxss_avx(auVar88,auVar48);
        auVar37 = vminss_avx(auVar37,auVar39);
        auVar42 = vmaxss_avx(auVar38,auVar42);
        auVar39 = vminss_avx(auVar43,auVar44);
        auVar38 = vmaxss_avx(auVar44,auVar43);
        auVar43 = vminss_avx512f(auVar46,auVar47);
        auVar44 = vmaxss_avx512f(auVar47,auVar46);
        vmaxss_avx(auVar44,auVar38);
        auVar70._0_16_ = vminss_avx512f(auVar39,auVar43);
        vucomiss_avx512f(auVar37);
        if ((!bVar28 && !bVar31) &&
           (auVar38 = vucomiss_avx512f(auVar34), bVar32 = bVar31, !bVar28 && !bVar31)) break;
        auVar38 = vucomiss_avx512f(auVar34);
        auVar39 = vucomiss_avx512f(auVar70._0_16_);
        auVar42 = vucomiss_avx512f(auVar34);
        bVar32 = bVar28 || bVar31;
        bVar29 = bVar28 || bVar31;
        if (!bVar28 && !bVar31) break;
        uVar10 = vcmpps_avx512vl(auVar37,auVar39,5);
        uVar11 = vcmpps_avx512vl(auVar70._0_16_,auVar39,5);
        uVar21 = (uint)uVar10 & (uint)uVar11;
        bVar19 = (uVar21 & 1) == 0;
        bVar32 = (!bVar28 && !bVar31) && bVar19;
        bVar29 = (!bVar28 && !bVar31) && (uVar21 & 1) == 0;
      } while ((bVar28 || bVar31) || !bVar19);
      auVar43 = vxorps_avx512vl(auVar229._0_16_,auVar229._0_16_);
      auVar229 = ZEXT1664(auVar43);
      vcmpss_avx512f(auVar37,auVar43,1);
      uVar10 = vcmpss_avx512f(auVar42,auVar43,1);
      bVar31 = (bool)((byte)uVar10 & 1);
      auVar75._16_16_ = auVar70._16_16_;
      auVar75._0_16_ = auVar235._0_16_;
      auVar74._4_28_ = auVar75._4_28_;
      auVar74._0_4_ = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * auVar235._0_4_);
      vucomiss_avx512f(auVar74._0_16_);
      bVar29 = (bool)(!bVar32 | bVar29);
      bVar32 = bVar29 == false;
      auVar77._16_16_ = auVar70._16_16_;
      auVar77._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar76._4_28_ = auVar77._4_28_;
      auVar76._0_4_ = (uint)bVar29 * auVar43._0_4_ + (uint)!bVar29 * 0x7f800000;
      auVar39 = auVar76._0_16_;
      auVar79._16_16_ = auVar70._16_16_;
      auVar79._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar78._4_28_ = auVar79._4_28_;
      auVar78._0_4_ = (uint)bVar29 * auVar43._0_4_ + (uint)!bVar29 * -0x800000;
      auVar34 = auVar78._0_16_;
      auVar44 = vxorps_avx512vl(auVar236._0_16_,auVar236._0_16_);
      auVar236 = ZEXT1664(auVar44);
      uVar10 = vcmpss_avx512f(auVar70._0_16_,auVar43,1);
      bVar31 = (bool)((byte)uVar10 & 1);
      auVar81._16_16_ = auVar70._16_16_;
      auVar81._0_16_ = auVar235._0_16_;
      auVar80._4_28_ = auVar81._4_28_;
      auVar80._0_4_ = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * auVar235._0_4_);
      auVar43 = vucomiss_avx512f(auVar80._0_16_);
      in_ZMM17 = ZEXT1664(auVar43);
      if ((bVar29) || (bVar32)) {
        auVar43 = vucomiss_avx512f(auVar37);
        if ((bVar29) || (bVar32)) {
          auVar17._8_4_ = 0x80000000;
          auVar17._0_8_ = 0x8000000080000000;
          auVar17._12_4_ = 0x80000000;
          auVar48 = vxorps_avx512vl(auVar37,auVar17);
          in_ZMM17 = ZEXT1664(auVar48);
          auVar37 = vsubss_avx512f(auVar43,auVar37);
          auVar37 = vdivss_avx512f(auVar48,auVar37);
          auVar43 = vsubss_avx512f(ZEXT416(0x3f800000),auVar37);
          auVar43 = vfmadd213ss_avx512f(auVar43,auVar44,auVar37);
          auVar37 = auVar43;
        }
        else {
          auVar37 = vxorps_avx512vl(auVar43,auVar43);
          vucomiss_avx512f(auVar37);
          auVar43 = ZEXT416(0x3f800000);
          if ((bVar29) || (bVar32)) {
            auVar43 = SUB6416(ZEXT464(0xff800000),0);
            auVar37 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar39 = vminss_avx512f(auVar39,auVar37);
        auVar34 = vmaxss_avx(auVar43,auVar34);
      }
      auVar235 = ZEXT464(0x3f800000);
      uVar10 = vcmpss_avx512f(auVar38,auVar44,1);
      bVar29 = (bool)((byte)uVar10 & 1);
      auVar37 = auVar235._0_16_;
      fVar183 = (float)((uint)bVar29 * -0x40800000 + (uint)!bVar29 * 0x3f800000);
      if ((auVar74._0_4_ != fVar183) || (NAN(auVar74._0_4_) || NAN(fVar183))) {
        fVar197 = auVar38._0_4_;
        fVar195 = auVar42._0_4_;
        if ((fVar197 != fVar195) || (NAN(fVar197) || NAN(fVar195))) {
          auVar16._8_4_ = 0x80000000;
          auVar16._0_8_ = 0x8000000080000000;
          auVar16._12_4_ = 0x80000000;
          auVar42 = vxorps_avx512vl(auVar42,auVar16);
          auVar171._0_4_ = auVar42._0_4_ / (fVar197 - fVar195);
          auVar171._4_12_ = auVar42._4_12_;
          auVar42 = vsubss_avx512f(auVar37,auVar171);
          auVar42 = vfmadd213ss_avx512f(auVar42,auVar44,auVar171);
          auVar38 = auVar42;
        }
        else if ((fVar195 != 0.0) || (auVar42 = auVar37, auVar38 = ZEXT816(0) << 0x40, NAN(fVar195))
                ) {
          auVar42 = SUB6416(ZEXT464(0xff800000),0);
          auVar38 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar39 = vminss_avx(auVar39,auVar38);
        auVar34 = vmaxss_avx(auVar42,auVar34);
      }
      bVar29 = auVar80._0_4_ != fVar183;
      auVar42 = vminss_avx512f(auVar39,auVar37);
      auVar83._16_16_ = auVar70._16_16_;
      auVar83._0_16_ = auVar39;
      auVar82._4_28_ = auVar83._4_28_;
      auVar82._0_4_ = (uint)bVar29 * auVar42._0_4_ + (uint)!bVar29 * auVar39._0_4_;
      auVar42 = vmaxss_avx512f(auVar37,auVar34);
      auVar85._16_16_ = auVar70._16_16_;
      auVar85._0_16_ = auVar34;
      auVar84._4_28_ = auVar85._4_28_;
      auVar84._0_4_ = (uint)bVar29 * auVar42._0_4_ + (uint)!bVar29 * auVar34._0_4_;
      auVar34 = vmaxss_avx512f(auVar44,auVar82._0_16_);
      auVar70._0_16_ = vminss_avx512f(auVar84._0_16_,auVar37);
    } while (auVar70._0_4_ < auVar34._0_4_);
    auVar39 = vmaxss_avx512f(auVar44,ZEXT416((uint)(auVar34._0_4_ + -0.1)));
    auVar48 = vminss_avx512f(ZEXT416((uint)(auVar70._0_4_ + 0.1)),auVar37);
    auVar115._0_8_ = auVar52._0_8_;
    auVar115._8_8_ = auVar115._0_8_;
    auVar187._8_8_ = auVar151._0_8_;
    auVar187._0_8_ = auVar151._0_8_;
    auVar206._8_8_ = auVar45._0_8_;
    auVar206._0_8_ = auVar45._0_8_;
    auVar34 = vshufpd_avx(auVar151,auVar151,3);
    auVar42 = vshufpd_avx(auVar45,auVar45,3);
    auVar38 = vshufps_avx(auVar39,auVar48,0);
    auVar45 = vsubps_avx512vl(auVar35,auVar38);
    fVar183 = auVar38._0_4_;
    auVar145._0_4_ = fVar183 * auVar40._0_4_;
    fVar195 = auVar38._4_4_;
    auVar145._4_4_ = fVar195 * auVar40._4_4_;
    fVar197 = auVar38._8_4_;
    auVar145._8_4_ = fVar197 * auVar40._8_4_;
    fVar199 = auVar38._12_4_;
    auVar145._12_4_ = fVar199 * auVar40._12_4_;
    auVar152._0_4_ = fVar183 * auVar34._0_4_;
    auVar152._4_4_ = fVar195 * auVar34._4_4_;
    auVar152._8_4_ = fVar197 * auVar34._8_4_;
    auVar152._12_4_ = fVar199 * auVar34._12_4_;
    auVar224._0_4_ = auVar42._0_4_ * fVar183;
    auVar224._4_4_ = auVar42._4_4_ * fVar195;
    auVar224._8_4_ = auVar42._8_4_ * fVar197;
    auVar224._12_4_ = auVar42._12_4_ * fVar199;
    auVar134._0_4_ = fVar183 * auVar41._0_4_;
    auVar134._4_4_ = fVar195 * auVar41._4_4_;
    auVar134._8_4_ = fVar197 * auVar41._8_4_;
    auVar134._12_4_ = fVar199 * auVar41._12_4_;
    auVar40 = vfmadd231ps_fma(auVar145,auVar45,auVar115);
    auVar41 = vfmadd231ps_fma(auVar152,auVar45,auVar187);
    auVar43 = vfmadd231ps_fma(auVar224,auVar45,auVar206);
    auVar45 = vfmadd231ps_fma(auVar134,auVar45,ZEXT816(0));
    auVar42 = vsubss_avx512f(auVar37,auVar39);
    auVar34 = vmovshdup_avx(auVar103);
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * auVar39._0_4_)),auVar103,auVar42);
    auVar42 = vsubss_avx512f(auVar37,auVar48);
    auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * auVar48._0_4_)),auVar103,auVar42);
    auVar48 = vdivss_avx512f(auVar37,ZEXT416((uint)fVar202));
    auVar34 = vsubps_avx(auVar41,auVar40);
    auVar38 = vmulps_avx512vl(auVar34,auVar36);
    auVar34 = vsubps_avx(auVar43,auVar41);
    auVar39 = vmulps_avx512vl(auVar34,auVar36);
    auVar34 = vsubps_avx(auVar45,auVar43);
    auVar34 = vmulps_avx512vl(auVar34,auVar36);
    auVar42 = vminps_avx(auVar39,auVar34);
    auVar34 = vmaxps_avx(auVar39,auVar34);
    auVar42 = vminps_avx(auVar38,auVar42);
    auVar34 = vmaxps_avx(auVar38,auVar34);
    auVar38 = vshufpd_avx(auVar42,auVar42,3);
    auVar39 = vshufpd_avx(auVar34,auVar34,3);
    auVar42 = vminps_avx(auVar42,auVar38);
    auVar34 = vmaxps_avx(auVar34,auVar39);
    fVar202 = auVar48._0_4_;
    auVar172._0_4_ = auVar42._0_4_ * fVar202;
    auVar172._4_4_ = auVar42._4_4_ * fVar202;
    auVar172._8_4_ = auVar42._8_4_ * fVar202;
    auVar172._12_4_ = auVar42._12_4_ * fVar202;
    auVar161._0_4_ = fVar202 * auVar34._0_4_;
    auVar161._4_4_ = fVar202 * auVar34._4_4_;
    auVar161._8_4_ = fVar202 * auVar34._8_4_;
    auVar161._12_4_ = fVar202 * auVar34._12_4_;
    auVar48 = vdivss_avx512f(auVar37,ZEXT416((uint)(auVar47._0_4_ - auVar46._0_4_)));
    auVar34 = vshufpd_avx(auVar40,auVar40,3);
    auVar42 = vshufpd_avx(auVar41,auVar41,3);
    auVar38 = vshufpd_avx(auVar43,auVar43,3);
    auVar39 = vshufpd_avx(auVar45,auVar45,3);
    auVar34 = vsubps_avx(auVar34,auVar40);
    auVar40 = vsubps_avx(auVar42,auVar41);
    auVar41 = vsubps_avx(auVar38,auVar43);
    auVar39 = vsubps_avx(auVar39,auVar45);
    auVar42 = vminps_avx(auVar34,auVar40);
    auVar34 = vmaxps_avx(auVar34,auVar40);
    auVar38 = vminps_avx(auVar41,auVar39);
    auVar38 = vminps_avx(auVar42,auVar38);
    auVar42 = vmaxps_avx(auVar41,auVar39);
    auVar34 = vmaxps_avx(auVar34,auVar42);
    fVar202 = auVar48._0_4_;
    auVar207._0_4_ = fVar202 * auVar38._0_4_;
    auVar207._4_4_ = fVar202 * auVar38._4_4_;
    auVar207._8_4_ = fVar202 * auVar38._8_4_;
    auVar207._12_4_ = fVar202 * auVar38._12_4_;
    auVar188._0_4_ = fVar202 * auVar34._0_4_;
    auVar188._4_4_ = fVar202 * auVar34._4_4_;
    auVar188._8_4_ = fVar202 * auVar34._8_4_;
    auVar188._12_4_ = fVar202 * auVar34._12_4_;
    auVar39 = vinsertps_avx(auVar33,auVar46,0x10);
    auVar49 = vpermt2ps_avx512vl(auVar33,_DAT_01fb9f90,auVar47);
    auVar104._0_4_ = auVar39._0_4_ + auVar49._0_4_;
    auVar104._4_4_ = auVar39._4_4_ + auVar49._4_4_;
    auVar104._8_4_ = auVar39._8_4_ + auVar49._8_4_;
    auVar104._12_4_ = auVar39._12_4_ + auVar49._12_4_;
    auVar15._8_4_ = 0x3f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar15._12_4_ = 0x3f000000;
    auVar48 = vmulps_avx512vl(auVar104,auVar15);
    auVar42 = vshufps_avx(auVar48,auVar48,0x54);
    uVar87 = auVar48._0_4_;
    auVar108._4_4_ = uVar87;
    auVar108._0_4_ = uVar87;
    auVar108._8_4_ = uVar87;
    auVar108._12_4_ = uVar87;
    auVar38 = vfmadd213ps_fma(local_c8,auVar108,local_268);
    auVar40 = vfmadd213ps_fma(local_d8,auVar108,local_278);
    auVar41 = vfmadd213ps_fma(local_e8,auVar108,local_288);
    auVar34 = vsubps_avx(auVar40,auVar38);
    auVar38 = vfmadd213ps_fma(auVar34,auVar108,auVar38);
    auVar34 = vsubps_avx(auVar41,auVar40);
    auVar34 = vfmadd213ps_fma(auVar34,auVar108,auVar40);
    auVar34 = vsubps_avx(auVar34,auVar38);
    auVar38 = vfmadd231ps_fma(auVar38,auVar34,auVar108);
    auVar43 = vmulps_avx512vl(auVar34,auVar36);
    auVar216._8_8_ = auVar38._0_8_;
    auVar216._0_8_ = auVar38._0_8_;
    auVar34 = vshufpd_avx(auVar38,auVar38,3);
    auVar38 = vshufps_avx(auVar48,auVar48,0x55);
    auVar40 = vsubps_avx(auVar34,auVar216);
    auVar41 = vfmadd231ps_fma(auVar216,auVar38,auVar40);
    auVar225._8_8_ = auVar43._0_8_;
    auVar225._0_8_ = auVar43._0_8_;
    auVar34 = vshufpd_avx(auVar43,auVar43,3);
    auVar34 = vsubps_avx512vl(auVar34,auVar225);
    auVar34 = vfmadd213ps_avx512vl(auVar34,auVar38,auVar225);
    auVar109._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
    auVar109._8_4_ = auVar40._8_4_ ^ 0x80000000;
    auVar109._12_4_ = auVar40._12_4_ ^ 0x80000000;
    auVar38 = vmovshdup_avx512vl(auVar34);
    auVar226._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
    auVar226._8_4_ = auVar38._8_4_ ^ 0x80000000;
    auVar226._12_4_ = auVar38._12_4_ ^ 0x80000000;
    auVar43 = vmovshdup_avx512vl(auVar40);
    auVar229 = ZEXT464(5);
    auVar45 = vpermt2ps_avx512vl(auVar226,ZEXT416(5),auVar40);
    auVar38 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar38._0_4_ * auVar40._0_4_)),auVar34,auVar43);
    auVar40 = vpermt2ps_avx512vl(auVar34,SUB6416(ZEXT464(4),0),auVar109);
    auVar135._0_4_ = auVar38._0_4_;
    auVar135._4_4_ = auVar135._0_4_;
    auVar135._8_4_ = auVar135._0_4_;
    auVar135._12_4_ = auVar135._0_4_;
    auVar34 = vdivps_avx(auVar45,auVar135);
    auVar50 = vdivps_avx512vl(auVar40,auVar135);
    fVar202 = auVar41._0_4_;
    auVar38 = vshufps_avx(auVar41,auVar41,0x55);
    auVar217._0_4_ = fVar202 * auVar34._0_4_ + auVar38._0_4_ * auVar50._0_4_;
    auVar217._4_4_ = fVar202 * auVar34._4_4_ + auVar38._4_4_ * auVar50._4_4_;
    auVar217._8_4_ = fVar202 * auVar34._8_4_ + auVar38._8_4_ * auVar50._8_4_;
    auVar217._12_4_ = fVar202 * auVar34._12_4_ + auVar38._12_4_ * auVar50._12_4_;
    auVar88 = vsubps_avx(auVar42,auVar217);
    auVar38 = vmovshdup_avx(auVar34);
    auVar42 = vinsertps_avx(auVar172,auVar207,0x1c);
    auVar227._0_4_ = auVar38._0_4_ * auVar42._0_4_;
    auVar227._4_4_ = auVar38._4_4_ * auVar42._4_4_;
    auVar227._8_4_ = auVar38._8_4_ * auVar42._8_4_;
    auVar227._12_4_ = auVar38._12_4_ * auVar42._12_4_;
    auVar52 = vinsertps_avx512f(auVar161,auVar188,0x1c);
    auVar38 = vmulps_avx512vl(auVar38,auVar52);
    auVar45 = vminps_avx512vl(auVar227,auVar38);
    auVar41 = vmaxps_avx(auVar38,auVar227);
    auVar43 = vmovshdup_avx(auVar50);
    auVar38 = vinsertps_avx(auVar207,auVar172,0x4c);
    auVar208._0_4_ = auVar43._0_4_ * auVar38._0_4_;
    auVar208._4_4_ = auVar43._4_4_ * auVar38._4_4_;
    auVar208._8_4_ = auVar43._8_4_ * auVar38._8_4_;
    auVar208._12_4_ = auVar43._12_4_ * auVar38._12_4_;
    auVar40 = vinsertps_avx(auVar188,auVar161,0x4c);
    auVar189._0_4_ = auVar43._0_4_ * auVar40._0_4_;
    auVar189._4_4_ = auVar43._4_4_ * auVar40._4_4_;
    auVar189._8_4_ = auVar43._8_4_ * auVar40._8_4_;
    auVar189._12_4_ = auVar43._12_4_ * auVar40._12_4_;
    auVar43 = vminps_avx(auVar208,auVar189);
    auVar45 = vaddps_avx512vl(auVar45,auVar43);
    auVar43 = vmaxps_avx(auVar189,auVar208);
    auVar190._0_4_ = auVar41._0_4_ + auVar43._0_4_;
    auVar190._4_4_ = auVar41._4_4_ + auVar43._4_4_;
    auVar190._8_4_ = auVar41._8_4_ + auVar43._8_4_;
    auVar190._12_4_ = auVar41._12_4_ + auVar43._12_4_;
    auVar209._8_8_ = 0x3f80000000000000;
    auVar209._0_8_ = 0x3f80000000000000;
    auVar41 = vsubps_avx(auVar209,auVar190);
    auVar43 = vsubps_avx(auVar209,auVar45);
    auVar45 = vsubps_avx(auVar39,auVar48);
    auVar48 = vsubps_avx(auVar49,auVar48);
    fVar199 = auVar45._0_4_;
    auVar228._0_4_ = fVar199 * auVar41._0_4_;
    fVar200 = auVar45._4_4_;
    auVar228._4_4_ = fVar200 * auVar41._4_4_;
    fVar201 = auVar45._8_4_;
    auVar228._8_4_ = fVar201 * auVar41._8_4_;
    fVar156 = auVar45._12_4_;
    auVar228._12_4_ = fVar156 * auVar41._12_4_;
    auVar51 = vbroadcastss_avx512vl(auVar34);
    auVar42 = vmulps_avx512vl(auVar51,auVar42);
    auVar52 = vmulps_avx512vl(auVar51,auVar52);
    auVar51 = vminps_avx512vl(auVar42,auVar52);
    auVar52 = vmaxps_avx512vl(auVar52,auVar42);
    auVar42 = vbroadcastss_avx512vl(auVar50);
    auVar38 = vmulps_avx512vl(auVar42,auVar38);
    auVar42 = vmulps_avx512vl(auVar42,auVar40);
    auVar40 = vminps_avx512vl(auVar38,auVar42);
    auVar40 = vaddps_avx512vl(auVar51,auVar40);
    auVar45 = vmulps_avx512vl(auVar45,auVar43);
    in_ZMM17 = ZEXT1664(auVar45);
    fVar202 = auVar48._0_4_;
    auVar191._0_4_ = fVar202 * auVar41._0_4_;
    fVar183 = auVar48._4_4_;
    auVar191._4_4_ = fVar183 * auVar41._4_4_;
    fVar195 = auVar48._8_4_;
    auVar191._8_4_ = fVar195 * auVar41._8_4_;
    fVar197 = auVar48._12_4_;
    auVar191._12_4_ = fVar197 * auVar41._12_4_;
    auVar210._0_4_ = fVar202 * auVar43._0_4_;
    auVar210._4_4_ = fVar183 * auVar43._4_4_;
    auVar210._8_4_ = fVar195 * auVar43._8_4_;
    auVar210._12_4_ = fVar197 * auVar43._12_4_;
    auVar42 = vmaxps_avx(auVar42,auVar38);
    auVar162._0_4_ = auVar52._0_4_ + auVar42._0_4_;
    auVar162._4_4_ = auVar52._4_4_ + auVar42._4_4_;
    auVar162._8_4_ = auVar52._8_4_ + auVar42._8_4_;
    auVar162._12_4_ = auVar52._12_4_ + auVar42._12_4_;
    auVar173._8_8_ = 0x3f800000;
    auVar173._0_8_ = 0x3f800000;
    auVar42 = vsubps_avx(auVar173,auVar162);
    auVar38 = vsubps_avx512vl(auVar173,auVar40);
    auVar221._0_4_ = fVar199 * auVar42._0_4_;
    auVar221._4_4_ = fVar200 * auVar42._4_4_;
    auVar221._8_4_ = fVar201 * auVar42._8_4_;
    auVar221._12_4_ = fVar156 * auVar42._12_4_;
    auVar218._0_4_ = fVar199 * auVar38._0_4_;
    auVar218._4_4_ = fVar200 * auVar38._4_4_;
    auVar218._8_4_ = fVar201 * auVar38._8_4_;
    auVar218._12_4_ = fVar156 * auVar38._12_4_;
    auVar163._0_4_ = fVar202 * auVar42._0_4_;
    auVar163._4_4_ = fVar183 * auVar42._4_4_;
    auVar163._8_4_ = fVar195 * auVar42._8_4_;
    auVar163._12_4_ = fVar197 * auVar42._12_4_;
    auVar174._0_4_ = fVar202 * auVar38._0_4_;
    auVar174._4_4_ = fVar183 * auVar38._4_4_;
    auVar174._8_4_ = fVar195 * auVar38._8_4_;
    auVar174._12_4_ = fVar197 * auVar38._12_4_;
    auVar42 = vminps_avx(auVar221,auVar218);
    auVar38 = vminps_avx512vl(auVar163,auVar174);
    auVar40 = vminps_avx512vl(auVar42,auVar38);
    auVar42 = vmaxps_avx(auVar218,auVar221);
    auVar38 = vmaxps_avx(auVar174,auVar163);
    auVar38 = vmaxps_avx(auVar38,auVar42);
    auVar41 = vminps_avx512vl(auVar228,auVar45);
    auVar42 = vminps_avx(auVar191,auVar210);
    auVar42 = vminps_avx(auVar41,auVar42);
    auVar42 = vhaddps_avx(auVar40,auVar42);
    auVar70._0_16_ = vmaxps_avx512vl(auVar45,auVar228);
    auVar40 = vmaxps_avx(auVar210,auVar191);
    auVar40 = vmaxps_avx(auVar40,auVar70._0_16_);
    auVar38 = vhaddps_avx(auVar38,auVar40);
    auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
    auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
    auVar164._0_4_ = auVar42._0_4_ + auVar88._0_4_;
    auVar164._4_4_ = auVar42._4_4_ + auVar88._4_4_;
    auVar164._8_4_ = auVar42._8_4_ + auVar88._8_4_;
    auVar164._12_4_ = auVar42._12_4_ + auVar88._12_4_;
    auVar175._0_4_ = auVar38._0_4_ + auVar88._0_4_;
    auVar175._4_4_ = auVar38._4_4_ + auVar88._4_4_;
    auVar175._8_4_ = auVar38._8_4_ + auVar88._8_4_;
    auVar175._12_4_ = auVar38._12_4_ + auVar88._12_4_;
    auVar42 = vmaxps_avx(auVar39,auVar164);
    auVar38 = vminps_avx(auVar175,auVar49);
    uVar1 = vcmpps_avx512vl(auVar38,auVar42,1);
  } while ((uVar1 & 3) != 0);
  uVar1 = vcmpps_avx512vl(auVar175,auVar49,1);
  uVar10 = vcmpps_avx512vl(auVar33,auVar164,1);
  if (((ushort)uVar10 & (ushort)uVar1 & 1) == 0) {
    bVar20 = 0;
  }
  else {
    auVar42 = vmovshdup_avx(auVar164);
    bVar20 = auVar46._0_4_ < auVar42._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
  }
  if (((!bVar28 || uVar5 != 0 && !bVar30) | bVar20) != 1) goto LAB_017d98ca;
  lVar24 = 0xc9;
  do {
    lVar24 = lVar24 + -1;
    if (lVar24 == 0) goto LAB_017d8a3b;
    auVar33 = vsubss_avx512f(auVar37,auVar88);
    fVar195 = auVar33._0_4_;
    fVar202 = fVar195 * fVar195 * fVar195;
    fVar197 = auVar88._0_4_;
    fVar183 = fVar197 * 3.0 * fVar195 * fVar195;
    fVar195 = fVar195 * fVar197 * fVar197 * 3.0;
    auVar123._4_4_ = fVar202;
    auVar123._0_4_ = fVar202;
    auVar123._8_4_ = fVar202;
    auVar123._12_4_ = fVar202;
    auVar116._4_4_ = fVar183;
    auVar116._0_4_ = fVar183;
    auVar116._8_4_ = fVar183;
    auVar116._12_4_ = fVar183;
    auVar92._4_4_ = fVar195;
    auVar92._0_4_ = fVar195;
    auVar92._8_4_ = fVar195;
    auVar92._12_4_ = fVar195;
    fVar197 = fVar197 * fVar197 * fVar197;
    auVar146._0_4_ = (float)local_f8._0_4_ * fVar197;
    auVar146._4_4_ = (float)local_f8._4_4_ * fVar197;
    auVar146._8_4_ = fStack_f0 * fVar197;
    auVar146._12_4_ = fStack_ec * fVar197;
    auVar33 = vfmadd231ps_fma(auVar146,local_288,auVar92);
    auVar33 = vfmadd231ps_fma(auVar33,local_278,auVar116);
    auVar33 = vfmadd231ps_fma(auVar33,local_268,auVar123);
    auVar93._8_8_ = auVar33._0_8_;
    auVar93._0_8_ = auVar33._0_8_;
    auVar33 = vshufpd_avx(auVar33,auVar33,3);
    auVar42 = vshufps_avx(auVar88,auVar88,0x55);
    auVar33 = vsubps_avx(auVar33,auVar93);
    auVar42 = vfmadd213ps_fma(auVar33,auVar42,auVar93);
    fVar202 = auVar42._0_4_;
    auVar33 = vshufps_avx(auVar42,auVar42,0x55);
    auVar94._0_4_ = auVar34._0_4_ * fVar202 + auVar50._0_4_ * auVar33._0_4_;
    auVar94._4_4_ = auVar34._4_4_ * fVar202 + auVar50._4_4_ * auVar33._4_4_;
    auVar94._8_4_ = auVar34._8_4_ * fVar202 + auVar50._8_4_ * auVar33._8_4_;
    auVar94._12_4_ = auVar34._12_4_ * fVar202 + auVar50._12_4_ * auVar33._12_4_;
    auVar88 = vsubps_avx(auVar88,auVar94);
    auVar33 = vandps_avx512vl(auVar42,auVar233._0_16_);
    auVar70._0_16_ = vprolq_avx512vl(auVar33,0x20);
    auVar33 = vmaxss_avx(auVar70._0_16_,auVar33);
    bVar30 = (float)local_108._0_4_ < auVar33._0_4_;
  } while ((float)local_108._0_4_ <= auVar33._0_4_);
  auVar33 = vucomiss_avx512f(auVar44);
  if (bVar30) goto LAB_017d8a3b;
  auVar34 = vucomiss_avx512f(auVar33);
  auVar235 = ZEXT1664(auVar34);
  if (bVar30) goto LAB_017d8a3b;
  vmovshdup_avx(auVar33);
  auVar34 = vucomiss_avx512f(auVar44);
  if (bVar30) goto LAB_017d8a3b;
  auVar42 = vucomiss_avx512f(auVar34);
  auVar235 = ZEXT1664(auVar42);
  if (bVar30) goto LAB_017d8a3b;
  auVar38 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar45 = vinsertps_avx(auVar38,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar38 = vsubps_avx(local_178,(undefined1  [16])aVar2);
  auVar38 = vdpps_avx(auVar38,auVar45,0x7f);
  auVar37 = vsubps_avx(local_1b8,(undefined1  [16])aVar2);
  auVar37 = vdpps_avx(auVar37,auVar45,0x7f);
  auVar39 = vsubps_avx(local_1c8,(undefined1  [16])aVar2);
  auVar39 = vdpps_avx(auVar39,auVar45,0x7f);
  auVar40 = vsubps_avx(local_198,(undefined1  [16])aVar2);
  auVar40 = vdpps_avx(auVar40,auVar45,0x7f);
  auVar41 = vsubps_avx(_local_188,(undefined1  [16])aVar2);
  auVar41 = vdpps_avx(auVar41,auVar45,0x7f);
  auVar43 = vsubps_avx(_local_1d8,(undefined1  [16])aVar2);
  auVar43 = vdpps_avx(auVar43,auVar45,0x7f);
  auVar44 = vsubps_avx(_local_1e8,(undefined1  [16])aVar2);
  auVar44 = vdpps_avx(auVar44,auVar45,0x7f);
  auVar48 = vsubps_avx(_local_1a8,(undefined1  [16])aVar2);
  auVar45 = vdpps_avx(auVar48,auVar45,0x7f);
  auVar48 = vsubss_avx512f(auVar42,auVar34);
  fVar202 = auVar34._0_4_;
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar202)),auVar48,auVar38);
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar202)),auVar48,auVar37);
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar202)),auVar48,auVar39);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar45._0_4_)),auVar48,auVar40);
  auVar70._0_16_ = vsubss_avx512f(auVar42,auVar33);
  auVar147._0_4_ = auVar70._0_4_;
  fVar202 = auVar147._0_4_ * auVar147._0_4_ * auVar147._0_4_;
  fVar199 = auVar33._0_4_;
  fVar183 = fVar199 * 3.0 * auVar147._0_4_ * auVar147._0_4_;
  fVar195 = auVar147._0_4_ * fVar199 * fVar199 * 3.0;
  fVar200 = fVar199 * fVar199 * fVar199;
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar39._0_4_)),ZEXT416((uint)fVar195),auVar37)
  ;
  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar183),auVar38);
  auVar34 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar202),auVar34);
  fVar197 = auVar34._0_4_;
  if ((fVar197 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
     (local_31c = (ray->super_RayK<1>).tfar, local_31c < fVar197)) goto LAB_017d8a3b;
  auVar34 = vshufps_avx(auVar33,auVar33,0x55);
  auVar38 = vsubps_avx512vl(auVar35,auVar34);
  fVar201 = auVar34._0_4_;
  auVar176._0_4_ = fVar201 * (float)local_188._0_4_;
  fVar156 = auVar34._4_4_;
  auVar176._4_4_ = fVar156 * (float)local_188._4_4_;
  fVar86 = auVar34._8_4_;
  auVar176._8_4_ = fVar86 * fStack_180;
  fVar95 = auVar34._12_4_;
  auVar176._12_4_ = fVar95 * fStack_17c;
  auVar180._0_4_ = fVar201 * (float)local_1d8._0_4_;
  auVar180._4_4_ = fVar156 * (float)local_1d8._4_4_;
  auVar180._8_4_ = fVar86 * fStack_1d0;
  auVar180._12_4_ = fVar95 * fStack_1cc;
  auVar192._0_4_ = fVar201 * (float)local_1e8._0_4_;
  auVar192._4_4_ = fVar156 * (float)local_1e8._4_4_;
  auVar192._8_4_ = fVar86 * fStack_1e0;
  auVar192._12_4_ = fVar95 * fStack_1dc;
  auVar153._0_4_ = fVar201 * (float)local_1a8._0_4_;
  auVar153._4_4_ = fVar156 * (float)local_1a8._4_4_;
  auVar153._8_4_ = fVar86 * fStack_1a0;
  auVar153._12_4_ = fVar95 * fStack_19c;
  auVar34 = vfmadd231ps_fma(auVar176,auVar38,local_178);
  auVar35 = vfmadd231ps_fma(auVar180,auVar38,local_1b8);
  auVar42 = vfmadd231ps_fma(auVar192,auVar38,local_1c8);
  auVar38 = vfmadd231ps_fma(auVar153,auVar38,local_198);
  auVar34 = vsubps_avx(auVar35,auVar34);
  auVar35 = vsubps_avx(auVar42,auVar35);
  auVar42 = vsubps_avx(auVar38,auVar42);
  auVar193._0_4_ = fVar199 * auVar35._0_4_;
  auVar193._4_4_ = fVar199 * auVar35._4_4_;
  auVar193._8_4_ = fVar199 * auVar35._8_4_;
  auVar193._12_4_ = fVar199 * auVar35._12_4_;
  auVar147._4_4_ = auVar147._0_4_;
  auVar147._8_4_ = auVar147._0_4_;
  auVar147._12_4_ = auVar147._0_4_;
  auVar34 = vfmadd231ps_fma(auVar193,auVar147,auVar34);
  auVar154._0_4_ = fVar199 * auVar42._0_4_;
  auVar154._4_4_ = fVar199 * auVar42._4_4_;
  auVar154._8_4_ = fVar199 * auVar42._8_4_;
  auVar154._12_4_ = fVar199 * auVar42._12_4_;
  auVar35 = vfmadd231ps_fma(auVar154,auVar147,auVar35);
  auVar155._0_4_ = fVar199 * auVar35._0_4_;
  auVar155._4_4_ = fVar199 * auVar35._4_4_;
  auVar155._8_4_ = fVar199 * auVar35._8_4_;
  auVar155._12_4_ = fVar199 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar155,auVar147,auVar34);
  auVar70._0_16_ = vmulps_avx512vl(auVar34,auVar36);
  pGVar6 = (context->scene->geometries).items[local_328].ptr;
  if ((pGVar6->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_017d8a3b;
  auVar136._0_4_ = fVar200 * (float)local_148._0_4_;
  auVar136._4_4_ = fVar200 * (float)local_148._4_4_;
  auVar136._8_4_ = fVar200 * fStack_140;
  auVar136._12_4_ = fVar200 * fStack_13c;
  auVar124._4_4_ = fVar195;
  auVar124._0_4_ = fVar195;
  auVar124._8_4_ = fVar195;
  auVar124._12_4_ = fVar195;
  auVar34 = vfmadd132ps_fma(auVar124,auVar136,local_138);
  auVar117._4_4_ = fVar183;
  auVar117._0_4_ = fVar183;
  auVar117._8_4_ = fVar183;
  auVar117._12_4_ = fVar183;
  auVar34 = vfmadd132ps_fma(auVar117,auVar34,local_128);
  auVar110._4_4_ = fVar202;
  auVar110._0_4_ = fVar202;
  auVar110._8_4_ = fVar202;
  auVar110._12_4_ = fVar202;
  auVar36 = vfmadd132ps_fma(auVar110,auVar34,local_118);
  auVar34 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar35 = vshufps_avx(auVar70._0_16_,auVar70._0_16_,0xc9);
  auVar111._0_4_ = auVar36._0_4_ * auVar35._0_4_;
  auVar111._4_4_ = auVar36._4_4_ * auVar35._4_4_;
  auVar111._8_4_ = auVar36._8_4_ * auVar35._8_4_;
  auVar111._12_4_ = auVar36._12_4_ * auVar35._12_4_;
  auVar35 = vfmsub231ps_fma(auVar111,auVar70._0_16_,auVar34);
  auVar34 = vshufps_avx(auVar35,auVar35,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar197;
    uVar10 = vmovlps_avx(auVar34);
    *(undefined8 *)&(ray->Ng).field_0 = uVar10;
    (ray->Ng).field_0.field_0.z = auVar35._0_4_;
    uVar10 = vmovlps_avx(auVar33);
    ray->u = (float)(int)uVar10;
    ray->v = (float)(int)((ulong)uVar10 >> 0x20);
    ray->primID = (uint)local_310;
    ray->geomID = (uint)local_328;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_017d8a3b;
  }
  local_218 = vmovlps_avx(auVar34);
  local_210 = auVar35._0_4_;
  local_20c = vmovlps_avx(auVar33);
  local_204 = (uint)local_310;
  local_200 = (uint)local_328;
  local_1fc = context->user->instID[0];
  local_1f8 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar197;
  local_32c = -1;
  local_248.valid = &local_32c;
  local_248.geometryUserPtr = pGVar6->userPtr;
  local_248.context = context->user;
  local_248.ray = (RTCRayN *)ray;
  local_248.hit = (RTCHitN *)&local_218;
  local_248.N = 1;
  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    local_250 = prim;
    (*pGVar6->intersectionFilterN)(&local_248);
    auVar235 = ZEXT464(0x3f800000);
    auVar232 = ZEXT3264(_DAT_01fb9fe0);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar231 = ZEXT1664(auVar33);
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT3264(auVar70);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar237 = ZEXT1664(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar234 = ZEXT1664(auVar33);
    auVar70._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar233 = ZEXT1664(auVar70._0_16_);
    prim = local_250;
    if (*local_248.valid == 0) goto LAB_017d98b9;
  }
  p_Var9 = context->args->filter;
  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var9)(&local_248);
    auVar235 = ZEXT464(0x3f800000);
    auVar232 = ZEXT3264(_DAT_01fb9fe0);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar231 = ZEXT1664(auVar33);
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT3264(auVar70);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar237 = ZEXT1664(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar234 = ZEXT1664(auVar33);
    auVar70._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar233 = ZEXT1664(auVar70._0_16_);
    if (*local_248.valid == 0) {
LAB_017d98b9:
      auVar235 = ZEXT464(0x3f800000);
      (ray->super_RayK<1>).tfar = local_31c;
      goto LAB_017d8a3b;
    }
  }
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).components[0] = *(float *)local_248.hit;
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.y = *(float *)(local_248.hit + 4);
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.z = *(float *)(local_248.hit + 8);
  *(float *)((long)local_248.ray + 0x3c) = *(float *)(local_248.hit + 0xc);
  *(float *)((long)local_248.ray + 0x40) = *(float *)(local_248.hit + 0x10);
  *(float *)((long)local_248.ray + 0x44) = *(float *)(local_248.hit + 0x14);
  *(float *)((long)local_248.ray + 0x48) = *(float *)(local_248.hit + 0x18);
  *(float *)((long)local_248.ray + 0x4c) = *(float *)(local_248.hit + 0x1c);
  *(float *)((long)local_248.ray + 0x50) = *(float *)(local_248.hit + 0x20);
  goto LAB_017d8a3b;
LAB_017d98ca:
  auVar103 = vinsertps_avx(auVar46,auVar47,0x10);
  goto LAB_017d84f5;
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }